

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_ebgodunov_plm_fpu.cpp
# Opt level: O2

void EBPLM::PredictStateOnYFace
               (Box *yebox,int ncomp,Array4<double> *Imy,Array4<double> *Ipy,Array4<const_double> *q
               ,Array4<const_double> *vmac,Array4<const_amrex::EBCellFlag> *flag,
               Array4<const_double> *vfrac,Array4<const_double> *fcx,Array4<const_double> *fcy,
               Array4<const_double> *fcz,Array4<const_double> *ccc,Geometry *geom,Real dt,
               Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *h_bcrec,BCRec *pbc,
               bool is_velocity)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  uint uVar17;
  int iVar18;
  uint uVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  uint uVar30;
  BCRec *bcrec;
  long lVar31;
  long lVar32;
  double *pdVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  double *pdVar37;
  long lVar38;
  long lVar39;
  double *pdVar40;
  long lVar41;
  long lVar42;
  long lVar43;
  double *pdVar44;
  long lVar45;
  long lVar46;
  long lVar47;
  EBCellFlag *pEVar48;
  long lVar49;
  long lVar50;
  double *pdVar51;
  long lVar52;
  long lVar53;
  double *pdVar54;
  long lVar55;
  double *pdVar56;
  long lVar57;
  long lVar58;
  long lVar59;
  double *pdVar60;
  long lVar61;
  long lVar62;
  long lVar63;
  double *pdVar64;
  long lVar65;
  long lVar66;
  long lVar67;
  undefined8 uVar68;
  undefined4 uVar69;
  undefined4 uVar70;
  undefined4 uVar71;
  undefined4 uVar72;
  undefined4 uVar73;
  undefined4 uVar74;
  undefined4 uVar75;
  undefined4 uVar76;
  undefined4 uVar77;
  undefined4 uVar78;
  undefined4 uVar79;
  int iVar80;
  int iVar81;
  bool bVar82;
  pair<bool,_bool> pVar83;
  pair<bool,_bool> pVar84;
  pair<bool,_bool> pVar85;
  int kk;
  int iVar86;
  int iVar87;
  int iVar88;
  long lVar89;
  long lVar90;
  long lVar91;
  long lVar92;
  long lVar93;
  long lVar94;
  long lVar95;
  long lVar96;
  long lVar97;
  long lVar98;
  long lVar99;
  long lVar100;
  double *pdVar101;
  Real *pRVar102;
  int iVar103;
  int iVar104;
  long lVar105;
  long lVar106;
  long lVar107;
  ulong uVar108;
  int iVar109;
  int iVar110;
  long lVar111;
  long lVar112;
  long lVar113;
  long lVar114;
  long lVar115;
  long lVar116;
  long lVar117;
  long lVar118;
  long lVar119;
  long lVar120;
  long lVar121;
  long lVar122;
  long lVar123;
  long lVar124;
  Real (*paRVar125) [3];
  long lVar126;
  int kk_3;
  long lVar127;
  long lVar128;
  long lVar129;
  int iVar130;
  char cVar131;
  uint uVar132;
  int iVar133;
  int iVar134;
  long lVar135;
  long lVar136;
  long lVar137;
  long lVar138;
  long lVar139;
  double *pdVar140;
  int iVar141;
  int iVar142;
  long lVar143;
  long lVar144;
  long lVar145;
  long lVar146;
  long lVar147;
  long lVar148;
  long lVar149;
  long lVar150;
  long lVar151;
  long lVar152;
  char cVar153;
  int iVar154;
  long lVar155;
  long lVar156;
  long lVar157;
  long lVar158;
  int kk_1;
  int iVar159;
  int iVar160;
  long lVar161;
  long lVar162;
  long lVar163;
  long lVar164;
  int iVar165;
  double *pdVar166;
  double *pdVar167;
  int iVar168;
  long lVar169;
  long lVar170;
  int k;
  int iVar171;
  int iVar172;
  long lVar173;
  long lVar174;
  long lVar175;
  long lVar176;
  long lVar177;
  long lVar178;
  int j;
  int iVar179;
  int iVar180;
  double *pdVar181;
  double *pdVar182;
  ulong uVar183;
  double dVar184;
  Real RVar185;
  double dVar186;
  double dVar187;
  double dVar188;
  double dVar190;
  undefined1 auVar189 [16];
  Real qj;
  double dVar191;
  ulong uVar192;
  double dVar193;
  undefined1 auVar194 [16];
  Real delta_x;
  double dVar195;
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  double dVar198;
  double dVar199;
  double dVar200;
  double dVar201;
  double dVar202;
  double dVar203;
  double dVar204;
  double dVar205;
  double dVar206;
  double dVar207;
  double dVar208;
  double dVar209;
  double dVar210;
  double dVar211;
  undefined4 uVar212;
  undefined4 uVar213;
  undefined4 uVar214;
  undefined4 uVar215;
  double *local_a00;
  double local_9b8;
  double local_9b0;
  long local_8b0;
  double *local_870;
  double *local_868;
  double *local_860;
  double *local_728;
  double *local_720;
  double *local_718;
  double local_708 [94];
  double local_418;
  double local_410;
  double local_408;
  double local_3f8;
  double dStack_3f0;
  double local_3d8;
  Real du [27];
  Real A [27] [3];
  
  dVar184 = dt / (geom->super_CoordSys).dx[1];
  iVar172 = (geom->domain).smallend.vect[0];
  bcrec = (h_bcrec->super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>).
          super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
          super__Vector_impl_data._M_start;
  iVar180 = (geom->domain).smallend.vect[1];
  iVar165 = (geom->domain).bigend.vect[0];
  iVar5 = (geom->domain).bigend.vect[1];
  pVar83 = anon_unknown.dwarf_5a37ad::has_extdir_or_ho(bcrec,ncomp,0);
  pVar84 = anon_unknown.dwarf_5a37ad::has_extdir_or_ho(bcrec,ncomp,1);
  iVar6 = (geom->domain).smallend.vect[2];
  iVar7 = (geom->domain).bigend.vect[2];
  pVar85 = anon_unknown.dwarf_5a37ad::has_extdir_or_ho(bcrec,ncomp,2);
  if ((((ushort)pVar83 & 1) == 0) || (iVar172 < (yebox->smallend).vect[0] + -1)) {
    iVar8 = (yebox->bigend).vect[0];
    if ((((iVar8 < iVar165 || ((ushort)pVar83 >> 8 & 1) == 0) &&
         ((((ushort)pVar85 & 1) == 0 || (iVar6 < (yebox->smallend).vect[2] + -1)))) &&
        ((((ushort)pVar85 >> 8 & 1) == 0 || ((yebox->bigend).vect[2] < iVar7)))) &&
       (((((ushort)pVar84 & 1) == 0 || (iVar180 < (yebox->smallend).vect[1] + -1)) &&
        ((((ushort)pVar84 >> 8 & 1) == 0 || ((yebox->bigend).vect[1] < iVar5)))))) {
      iVar172 = (ccc->begin).z;
      lVar105 = (long)(yebox->smallend).vect[2];
      if (ncomp < 1) {
        ncomp = 0;
      }
      lVar31 = ccc->kstride;
      lVar89 = (~(long)iVar172 + lVar105) * lVar31;
      iVar180 = (yebox->smallend).vect[0];
      lVar145 = (long)iVar180;
      lVar32 = ccc->nstride;
      uVar9 = (ccc->begin).x;
      lVar169 = (long)(int)uVar9;
      pdVar33 = q->p;
      lVar34 = q->jstride;
      lVar35 = q->kstride;
      lVar36 = q->nstride;
      uVar10 = (q->begin).x;
      lVar135 = (long)(int)uVar10;
      iVar165 = (q->begin).y;
      lVar161 = (long)iVar165;
      iVar5 = (q->begin).z;
      lVar162 = (long)iVar5;
      pdVar37 = vmac->p;
      lVar38 = vmac->jstride;
      lVar39 = vmac->kstride;
      lVar163 = (long)(vmac->begin).x;
      iVar6 = (vmac->begin).y;
      iVar7 = (vmac->begin).z;
      pdVar40 = Imy->p;
      lVar41 = Imy->jstride;
      lVar42 = Imy->kstride;
      lVar43 = Imy->nstride;
      iVar8 = (Imy->begin).x;
      iVar11 = (Imy->begin).y;
      iVar12 = (Imy->begin).z;
      pdVar44 = Ipy->p;
      lVar45 = Ipy->jstride;
      lVar46 = Ipy->kstride;
      lVar47 = Ipy->nstride;
      iVar13 = (Ipy->begin).x;
      uVar14 = (Ipy->begin).y;
      iVar15 = (Ipy->begin).z;
      pEVar48 = flag->p;
      lVar49 = flag->jstride;
      lVar50 = flag->kstride;
      iVar16 = (flag->begin).x;
      lVar127 = (long)(flag->begin).y;
      iVar130 = (flag->begin).z;
      pdVar51 = vfrac->p;
      lVar52 = vfrac->jstride;
      lVar53 = vfrac->kstride;
      uVar17 = (vfrac->begin).x;
      lVar128 = (long)(int)uVar17;
      iVar18 = (vfrac->begin).y;
      lVar173 = (long)iVar18;
      uVar19 = (vfrac->begin).z;
      lVar90 = (long)(int)uVar19;
      pdVar54 = ccc->p;
      lVar55 = ccc->jstride;
      iVar20 = (ccc->begin).y;
      pdVar56 = fcx->p;
      lVar57 = fcx->jstride;
      lVar58 = fcx->kstride;
      lVar59 = fcx->nstride;
      iVar21 = (fcx->begin).x;
      lVar174 = (long)(fcx->begin).y;
      iVar22 = (fcx->begin).z;
      pdVar60 = fcy->p;
      lVar61 = fcy->jstride;
      lVar62 = fcy->kstride;
      lVar63 = fcy->nstride;
      lVar175 = (long)(fcy->begin).x;
      iVar23 = (fcy->begin).y;
      iVar24 = (fcy->begin).z;
      pdVar64 = fcz->p;
      lVar65 = fcz->jstride;
      lVar66 = fcz->kstride;
      lVar67 = fcz->nstride;
      lVar176 = (long)(fcz->begin).x;
      lVar177 = (long)(fcz->begin).y;
      iVar25 = (fcz->begin).z;
      iVar26 = (yebox->smallend).vect[1];
      iVar27 = (yebox->bigend).vect[0];
      iVar28 = (yebox->bigend).vect[1];
      iVar29 = (yebox->bigend).vect[2];
      uVar108 = 0;
      uVar132 = ~uVar10;
      do {
        if (uVar108 == (uint)ncomp) {
          return;
        }
        lVar111 = uVar108 * lVar36;
        lVar91 = lVar105;
        local_870 = pdVar54 + ((lVar32 * 2 + lVar89 + lVar145 + -1) - lVar169);
        local_868 = pdVar54 + ((lVar32 + lVar89 + lVar145 + -1) - lVar169);
        local_860 = pdVar54 + ((lVar89 + lVar145 + -1) - lVar169);
        while (lVar91 <= iVar29) {
          lVar106 = (lVar91 - iVar130) * lVar50;
          lVar1 = lVar91 + 1;
          lVar129 = (lVar91 - lVar90) * lVar53;
          lVar143 = (lVar91 - lVar162) * lVar35;
          lVar178 = (lVar91 - iVar7) * lVar39;
          lVar112 = (lVar91 - iVar24) * lVar62;
          lVar113 = (lVar91 - iVar172) * lVar31;
          iVar86 = (int)lVar91;
          iVar109 = iVar86 - iVar5;
          lVar114 = iVar109 * lVar35;
          lVar115 = ((lVar91 + -1) - lVar90) * lVar53;
          lVar116 = (lVar1 - lVar90) * lVar53;
          lVar170 = ((lVar91 + -1) - lVar162) * lVar35;
          lVar117 = (lVar1 - lVar162) * lVar35;
          lVar118 = (lVar91 - iVar22) * lVar58;
          lVar155 = ((int)lVar1 - iVar25) * lVar66;
          lVar156 = (lVar91 - iVar25) * lVar66;
          lVar119 = (int)(~uVar19 + iVar86) * lVar53;
          lVar120 = (int)((int)lVar1 - uVar19) * lVar53;
          lVar121 = (long)iVar26;
          while (lVar121 <= iVar28) {
            if (iVar27 < iVar180) {
              lVar121 = lVar121 + 1;
            }
            else {
              lVar92 = lVar121 - lVar127;
              lVar93 = (lVar121 - lVar173) * lVar52;
              lVar2 = lVar121 + -1;
              lVar94 = (lVar2 - lVar173) * lVar52;
              lVar126 = lVar121 + -2;
              lVar95 = (lVar126 - lVar173) * lVar52;
              lVar3 = lVar121 + 1;
              lVar96 = (lVar3 - lVar173) * lVar52;
              lVar4 = lVar121 + 2;
              lVar97 = (lVar121 - lVar161) * lVar34;
              lVar136 = (lVar121 - iVar6) * lVar38;
              lVar137 = (lVar2 - lVar161) * lVar34;
              lVar138 = (lVar3 - lVar161) * lVar34;
              lVar139 = (lVar126 - lVar161) * lVar34;
              lVar146 = (lVar121 - iVar23) * lVar61;
              lVar147 = (lVar121 - iVar20) * lVar55;
              iVar103 = (int)lVar121;
              iVar133 = iVar103 - iVar165;
              lVar148 = iVar133 * lVar34;
              iVar168 = (int)lVar3;
              lVar149 = (lVar121 - lVar174) * lVar57;
              lVar150 = (lVar121 - lVar177) * lVar65;
              lVar151 = (iVar168 - iVar18) * lVar52;
              lVar152 = ((int)lVar126 - iVar18) * lVar52;
              lVar144 = ((int)lVar126 - iVar165) * lVar34;
              iVar87 = (int)lVar2 - iVar20;
              iVar88 = (int)lVar2 - iVar165;
              lVar98 = iVar88 * lVar34;
              lVar99 = (lVar2 - lVar174) * lVar57;
              lVar157 = (lVar2 - lVar177) * lVar65;
              lVar107 = lVar121 - iVar11;
              lVar121 = (~(long)iVar20 + lVar121) * lVar55 * 8;
              local_720 = (double *)((long)local_870 + lVar121);
              local_728 = (double *)((long)local_868 + lVar121);
              local_718 = (double *)(lVar121 + (long)local_860);
              lVar126 = lVar145;
              iVar80 = iVar180 - uVar10;
              iVar81 = (iVar180 - uVar10) + -1;
              do {
                lVar121 = lVar126 - iVar16;
                uVar30 = pEVar48[lVar106 + lVar92 * lVar49 + lVar121].flag;
                dVar208 = 0.0;
                dVar193 = 0.0;
                if ((short)uVar30 < 0) {
                  lVar122 = lVar126 - lVar128;
                  dVar202 = pdVar51[lVar93 + lVar122 + lVar129];
                  iVar141 = (int)lVar126;
                  if ((dVar202 != 1.0) || (NAN(dVar202))) {
LAB_00407086:
                    local_8b0 = lVar126 - lVar175;
                    local_9b8 = pdVar60[lVar112 + lVar146 + local_8b0];
                    local_9b0 = (pdVar60 + lVar112 + lVar146 + local_8b0)[lVar63];
                    lVar100 = lVar126 - lVar169;
                    dVar193 = pdVar54[lVar113 + lVar147 + lVar100 + lVar32];
                    dVar188 = pdVar54[lVar113 + lVar147 + lVar100];
                    dVar195 = pdVar54[lVar113 + lVar147 + lVar100 + lVar32 * 2];
                    iVar142 = iVar141 - uVar10;
                    lVar123 = (long)iVar142;
                    dVar205 = pdVar33[lVar148 + lVar123 + lVar114 + lVar111];
                    dVar187 = pdVar33[lVar137 + lVar114 + lVar111 + lVar123];
                    iVar159 = 0;
                    cVar153 = '\x05';
                    pdVar101 = local_728;
                    pdVar166 = local_720;
                    pdVar181 = local_718;
                    for (lVar100 = -1; lVar100 != 2; lVar100 = lVar100 + 1) {
                      pdVar140 = pdVar101;
                      pdVar167 = pdVar166;
                      pdVar182 = pdVar181;
                      iVar154 = iVar159;
                      cVar131 = cVar153;
                      for (lVar124 = -1; iVar154 = iVar154 + 3, lVar124 != 2; lVar124 = lVar124 + 1)
                      {
                        lVar164 = (long)iVar159;
                        paRVar125 = A + lVar164;
                        iVar159 = iVar159 + 3;
                        for (lVar158 = 0; iVar154 - lVar164 != lVar158; lVar158 = lVar158 + 1) {
                          iVar104 = (int)lVar158 + -1;
                          if ((((int)lVar124 == 0 && (int)lVar100 == 0) && iVar104 == 0) ||
                             ((1 << (cVar131 + (char)lVar158 & 0x1fU) & uVar30) == 0)) {
                            (*paRVar125)[0] = 0.0;
                            (*paRVar125)[1] = 0.0;
                            (*paRVar125)[2] = 0.0;
                          }
                          else {
                            dVar208 = pdVar140[lVar158];
                            (*paRVar125)[0] = (pdVar182[lVar158] + (double)iVar104) - dVar188;
                            (*paRVar125)[1] = (dVar208 + (double)(int)lVar124) - dVar193;
                            (*paRVar125)[2] = (pdVar167[lVar158] + (double)(int)lVar100) - dVar195;
                          }
                          paRVar125 = paRVar125 + 1;
                        }
                        pdVar167 = pdVar167 + lVar55;
                        pdVar140 = pdVar140 + lVar55;
                        pdVar182 = pdVar182 + lVar55;
                        cVar131 = cVar131 + '\x03';
                      }
                      pdVar166 = pdVar166 + lVar31;
                      pdVar101 = pdVar101 + lVar31;
                      pdVar181 = pdVar181 + lVar31;
                      cVar153 = cVar153 + '\t';
                    }
                    iVar159 = 0;
                    cVar153 = '\x05';
                    for (lVar100 = -1; lVar100 != 2; lVar100 = lVar100 + 1) {
                      iVar154 = iVar159;
                      cVar131 = cVar153;
                      for (lVar124 = -1; iVar154 = iVar154 + 3, lVar124 != 2; lVar124 = lVar124 + 1)
                      {
                        lVar158 = (long)iVar159;
                        iVar159 = iVar159 + 3;
                        for (lVar164 = 0; iVar154 - lVar158 != lVar164; lVar164 = lVar164 + 1) {
                          RVar185 = 0.0;
                          if (((int)lVar164 != 1 || ((int)lVar124 != 0 || (int)lVar100 != 0)) &&
                             ((1 << (cVar131 + (char)lVar164 & 0x1fU) & uVar30) != 0)) {
                            RVar185 = pdVar33[lVar111 + (iVar109 + (int)lVar100) * lVar35 +
                                                        (iVar133 + (int)lVar124) * lVar34 +
                                                        (long)(iVar81 + (int)lVar164)] - dVar205;
                          }
                          du[lVar158 + lVar164] = RVar185;
                        }
                        cVar131 = cVar131 + '\x03';
                      }
                      cVar153 = cVar153 + '\t';
                    }
                    pdVar101 = &local_418;
                    for (lVar100 = 0; lVar100 != 3; lVar100 = lVar100 + 1) {
                      for (lVar124 = -0x48; lVar124 != 0; lVar124 = lVar124 + 0x18) {
                        *(undefined8 *)((long)pdVar101 + lVar124 + 0x48) = 0;
                      }
                      local_708[lVar100] = 0.0;
                      pdVar101 = pdVar101 + 1;
                    }
                    pRVar102 = A[0] + 2;
                    dVar208 = dStack_3f0;
                    dVar209 = local_410;
                    dVar186 = local_3f8;
                    dVar190 = local_408;
                    dVar203 = local_3d8;
                    dVar200 = local_708[0];
                    dVar201 = local_418;
                    dVar198 = local_708[1];
                    dVar199 = local_708[2];
                    for (lVar100 = 0; lVar100 != 0x1b; lVar100 = lVar100 + 1) {
                      dVar204 = (*(Real (*) [3])(pRVar102 + -2))[0];
                      dVar207 = pRVar102[-1];
                      dVar191 = *pRVar102;
                      dVar186 = dVar186 + dVar207 * pRVar102[-1];
                      dVar190 = dVar190 + dVar204 * *pRVar102;
                      dVar208 = dVar208 + dVar191 * dVar207;
                      dVar209 = dVar209 + dVar207 * dVar204;
                      dVar203 = dVar203 + dVar191 * dVar191;
                      dVar191 = du[lVar100];
                      dVar200 = dVar200 + dVar204 * dVar191;
                      dVar201 = dVar201 + dVar204 * dVar204;
                      dVar198 = dVar198 + dVar191 * pRVar102[-1];
                      dVar199 = dVar199 + dVar191 * *pRVar102;
                      pRVar102 = pRVar102 + 3;
                    }
                    dVar191 = dVar209 * dVar203 - dVar190 * dVar208;
                    dVar211 = dVar209 * dVar199 - dVar190 * dVar198;
                    dVar207 = dVar209 * dVar208 + dVar190 * -dVar186;
                    dVar204 = dVar203 * dVar186 - dVar208 * dVar208;
                    dVar203 = dVar203 * dVar198 - dVar208 * dVar199;
                    auVar196._0_8_ =
                         dVar190 * (dVar208 * dVar198 - dVar199 * dVar186) +
                         (dVar200 * dVar204 - dVar203 * dVar209);
                    auVar196._8_8_ = dVar190 * dVar211 + (dVar201 * dVar203 - dVar191 * dVar200);
                    dVar190 = dVar207 * dVar190 + (dVar204 * dVar201 - dVar191 * dVar209);
                    auVar197._8_8_ = dVar190;
                    auVar197._0_8_ = dVar190;
                    auVar197 = divpd(auVar196,auVar197);
                    dVar190 = (dVar207 * dVar200 +
                              ((dVar199 * dVar186 + -dVar198 * dVar208) * dVar201 -
                              dVar211 * dVar209)) / dVar190;
                    dVar209 = auVar197._0_8_;
                    dVar186 = auVar197._8_8_;
                    if ((dVar202 == 1.0) && (!NAN(dVar202))) {
                      if ((pdVar51[lVar93 + lVar129 + ((lVar126 + -1) - lVar128)] == 1.0) &&
                         (!NAN(pdVar51[lVar93 + lVar129 + ((lVar126 + -1) - lVar128)]))) {
                        if ((pdVar51[lVar93 + lVar129 + ((lVar126 + 1) - lVar128)] == 1.0) &&
                           (!NAN(pdVar51[lVar93 + lVar129 + ((lVar126 + 1) - lVar128)]))) {
                          dVar200 = dVar205 - pdVar33[lVar148 + lVar114 + lVar111 + ((lVar126 + -1)
                                                                                    - lVar135)];
                          dVar201 = pdVar33[lVar148 + lVar114 + lVar111 + ((lVar126 + 1) - lVar135)]
                                    - dVar205;
                          dVar200 = dVar200 + dVar200;
                          dVar201 = dVar201 + dVar201;
                          dVar209 = (pdVar33[lVar148 + lVar114 + lVar111 + ((lVar126 + 1) - lVar135)
                                            ] -
                                    pdVar33[lVar148 + lVar114 + lVar111 + ((lVar126 + -1) - lVar135)
                                           ]) * 0.5;
                          dVar203 = ABS(dVar200);
                          uVar183 = -(ulong)(0.0 < dVar209);
                          dVar209 = ABS(dVar209);
                          dVar208 = ABS(dVar201);
                          if (dVar203 <= dVar209) {
                            dVar209 = dVar203;
                          }
                          if (dVar209 <= dVar208) {
                            dVar208 = dVar209;
                          }
                          uVar192 = -(ulong)(0.0 < dVar200 * dVar201) & (ulong)dVar208;
                          dVar209 = (double)(~uVar183 & (uVar192 ^ 0x8000000000000000) |
                                            uVar183 & uVar192);
                        }
                      }
                      if ((((pdVar51[lVar94 + lVar129 + lVar122] == 1.0) &&
                           (!NAN(pdVar51[lVar94 + lVar129 + lVar122]))) &&
                          (pdVar51[lVar129 + lVar96 + lVar122] == 1.0)) &&
                         (!NAN(pdVar51[lVar129 + lVar96 + lVar122]))) {
                        dVar200 = pdVar33[lVar138 + lVar114 + lVar111 + lVar123] - dVar205;
                        dVar203 = (dVar205 - dVar187) + (dVar205 - dVar187);
                        dVar200 = dVar200 + dVar200;
                        dVar186 = (pdVar33[lVar138 + lVar114 + lVar111 + lVar123] - dVar187) * 0.5;
                        dVar201 = ABS(dVar203);
                        uVar183 = -(ulong)(0.0 < dVar186);
                        dVar186 = ABS(dVar186);
                        dVar208 = ABS(dVar200);
                        if (dVar201 <= dVar186) {
                          dVar186 = dVar201;
                        }
                        if (dVar186 <= dVar208) {
                          dVar208 = dVar186;
                        }
                        uVar192 = -(ulong)(0.0 < dVar203 * dVar200) & (ulong)dVar208;
                        dVar186 = (double)(~uVar183 & (uVar192 ^ 0x8000000000000000) |
                                          uVar183 & uVar192);
                      }
                      if (((pdVar51[lVar93 + lVar122 + lVar115] == 1.0) &&
                          (!NAN(pdVar51[lVar93 + lVar122 + lVar115]))) &&
                         ((pdVar51[lVar93 + lVar122 + lVar116] == 1.0 &&
                          (!NAN(pdVar51[lVar93 + lVar122 + lVar116]))))) {
                        dVar200 = dVar205 - pdVar33[lVar148 + lVar123 + lVar170 + lVar111];
                        dVar201 = pdVar33[lVar148 + lVar123 + lVar117 + lVar111] - dVar205;
                        dVar200 = dVar200 + dVar200;
                        dVar201 = dVar201 + dVar201;
                        dVar190 = (pdVar33[lVar148 + lVar123 + lVar117 + lVar111] -
                                  pdVar33[lVar148 + lVar123 + lVar170 + lVar111]) * 0.5;
                        dVar203 = ABS(dVar200);
                        uVar183 = -(ulong)(0.0 < dVar190);
                        dVar190 = ABS(dVar190);
                        dVar208 = ABS(dVar201);
                        if (dVar203 <= dVar190) {
                          dVar190 = dVar203;
                        }
                        if (dVar190 <= dVar208) {
                          dVar208 = dVar190;
                        }
                        uVar192 = -(ulong)(0.0 < dVar200 * dVar201) & (ulong)dVar208;
                        dVar190 = (double)(~uVar183 & (uVar192 ^ 0x8000000000000000) |
                                          uVar183 & uVar192);
                      }
                    }
                    dVar208 = dVar187;
                    if (dVar205 <= dVar187) {
                      dVar208 = dVar205;
                    }
                    if (dVar187 <= dVar205) {
                      dVar187 = dVar205;
                    }
                    iVar104 = 0;
                    iVar160 = 0;
                    iVar179 = 0;
                    iVar159 = 0;
                    iVar154 = -1;
                    while (iVar154 != 2) {
                      iVar134 = iVar104;
                      iVar110 = -1;
                      while (iVar110 != 2) {
                        for (iVar171 = 5; iVar171 != 8; iVar171 = iVar171 + 1) {
                          if (((uVar30 >> (iVar134 + iVar171 & 0x1fU) & 1) != 0) &&
                             ((iVar171 != 6 || iVar110 != 0) || iVar154 != 0)) {
                            iVar159 = iVar159 + (uint)((iVar171 - 5U & 0xfffffffd) == 0 &&
                                                      (iVar110 == 0 && iVar154 == 0));
                            iVar179 = iVar179 + (uint)((iVar171 == 6 && iVar154 == 0) &&
                                                      (iVar110 == 1 || iVar110 + 1 == 0));
                            iVar160 = iVar160 + (uint)((iVar171 == 6 && iVar110 == 0) &&
                                                      (iVar154 == 1 || iVar154 + 1 == 0));
                          }
                        }
                        iVar134 = iVar134 + 3;
                        iVar110 = iVar110 + 1;
                      }
                      iVar104 = iVar104 + 9;
                      iVar154 = iVar154 + 1;
                    }
                    dVar203 = 2.0;
                    if ((uVar30 >> 0x15 & 1) != 0) {
                      cVar153 = '\b';
                      dVar203 = dVar205;
                      dVar200 = dVar205;
                      for (lVar100 = -1; lVar100 != 2; lVar100 = lVar100 + 1) {
                        cVar131 = cVar153;
                        for (lVar124 = 0; lVar124 != 2; lVar124 = lVar124 + 1) {
                          for (lVar158 = 0; lVar158 != 3; lVar158 = lVar158 + 1) {
                            if (((int)lVar158 != 1 || ((int)lVar124 != 0 || (int)lVar100 != 0)) &&
                               ((1 << (cVar131 + (char)lVar158 & 0x1fU) & uVar30) != 0)) {
                              dVar201 = pdVar33[lVar111 + (iVar109 + (int)lVar100) * lVar35 +
                                                          (iVar133 + (int)lVar124) * lVar34 +
                                                          (long)(iVar81 + (int)lVar158)];
                              dVar198 = dVar201;
                              if (dVar201 <= dVar203) {
                                dVar198 = dVar203;
                              }
                              dVar203 = dVar198;
                              if (dVar201 < dVar200) {
                                dVar200 = dVar201;
                              }
                            }
                          }
                          cVar131 = cVar131 + '\x03';
                        }
                        cVar153 = cVar153 + '\t';
                      }
                      dVar201 = (((pdVar60 + lVar112 + (iVar168 - iVar23) * lVar61 + local_8b0)
                                  [lVar63] - dVar195) * dVar190 +
                                (0.5 - dVar193) * dVar186 +
                                (pdVar60[lVar112 + (iVar168 - iVar23) * lVar61 + local_8b0] -
                                dVar188) * dVar209 + dVar205) - dVar205;
                      if (dVar201 <= 1e-13) {
                        dVar203 = 1.0;
                        if ((dVar201 < -1e-13) &&
                           (dVar203 = (dVar200 - dVar205) / dVar201, 1.0 <= dVar203)) {
                          dVar203 = 1.0;
                        }
                      }
                      else {
                        dVar203 = (dVar203 - dVar205) / dVar201;
                        if (1.0 <= dVar203) {
                          dVar203 = 1.0;
                        }
                      }
                      if (2.0 <= dVar203) {
                        dVar203 = 2.0;
                      }
                    }
                    cVar153 = '\x05';
                    dVar200 = dVar205;
                    dVar201 = dVar205;
                    for (lVar100 = -1; lVar100 != 2; lVar100 = lVar100 + 1) {
                      cVar131 = cVar153;
                      for (lVar124 = -1; lVar124 != 1; lVar124 = lVar124 + 1) {
                        for (lVar158 = 0; lVar158 != 3; lVar158 = lVar158 + 1) {
                          if (((int)lVar158 != 1 || ((int)lVar124 != 0 || (int)lVar100 != 0)) &&
                             ((1 << (cVar131 + (char)lVar158 & 0x1fU) & uVar30) != 0)) {
                            dVar198 = pdVar33[lVar111 + (iVar109 + (int)lVar100) * lVar35 +
                                                        (iVar133 + (int)lVar124) * lVar34 +
                                                        (long)(iVar81 + (int)lVar158)];
                            dVar199 = dVar198;
                            if (dVar198 <= dVar200) {
                              dVar199 = dVar200;
                            }
                            dVar200 = dVar199;
                            if (dVar198 < dVar201) {
                              dVar201 = dVar198;
                            }
                          }
                        }
                        cVar131 = cVar131 + '\x03';
                      }
                      cVar153 = cVar153 + '\t';
                    }
                    dVar198 = ((local_9b0 - dVar195) * dVar190 +
                              (((local_9b8 - dVar188) * dVar209 + dVar205) -
                              (dVar193 + 0.5) * dVar186)) - dVar205;
                    if (dVar198 <= 1e-13) {
                      dVar200 = 1.0;
                      if ((dVar198 < -1e-13) &&
                         (dVar200 = (dVar201 - dVar205) / dVar198, 1.0 <= dVar200)) {
                        dVar200 = 1.0;
                      }
                    }
                    else {
                      dVar200 = (dVar200 - dVar205) / dVar198;
                      if (1.0 <= dVar200) {
                        dVar200 = 1.0;
                      }
                    }
                    if (dVar203 <= dVar200) {
                      dVar200 = dVar203;
                    }
                    uVar212 = SUB84(dVar205,0);
                    uVar214 = (undefined4)((ulong)dVar205 >> 0x20);
                    dVar203 = dVar200;
                    if ((uVar30 >> 0x13 & 1) != 0) {
                      cVar153 = '\x06';
                      dVar201 = dVar205;
                      for (lVar100 = -1; lVar100 != 2; lVar100 = lVar100 + 1) {
                        cVar131 = cVar153;
                        for (lVar124 = -1; lVar124 != 2; lVar124 = lVar124 + 1) {
                          for (lVar158 = 0; lVar158 != 2; lVar158 = lVar158 + 1) {
                            if ((((int)lVar124 == 0 && (int)lVar100 == 0) && (int)lVar158 == 0) ||
                               ((1 << (cVar131 + (char)lVar158 & 0x1fU) & uVar30) == 0)) {
                              dVar198 = (double)CONCAT44(uVar214,uVar212);
                              dVar203 = dVar201;
                            }
                            else {
                              dVar203 = pdVar33[lVar111 + (iVar109 + (int)lVar100) * lVar35 +
                                                          (iVar133 + (int)lVar124) * lVar34 +
                                                          (long)(iVar80 + (int)lVar158)];
                              dVar198 = dVar203;
                              if (dVar203 <= (double)CONCAT44(uVar214,uVar212)) {
                                dVar198 = (double)CONCAT44(uVar214,uVar212);
                              }
                              if (dVar201 <= dVar203) {
                                dVar203 = dVar201;
                              }
                            }
                            uVar212 = SUB84(dVar198,0);
                            uVar214 = (undefined4)((ulong)dVar198 >> 0x20);
                            dVar201 = dVar203;
                          }
                          cVar131 = cVar131 + '\x03';
                        }
                        cVar153 = cVar153 + '\t';
                      }
                      dVar198 = (((pdVar56 + lVar118 + lVar149 + ((iVar141 - iVar21) + 1))[lVar59] -
                                 dVar195) * dVar190 +
                                (pdVar56[lVar118 + lVar149 + ((iVar141 - iVar21) + 1)] - dVar193) *
                                dVar186 + (0.5 - dVar188) * dVar209 + dVar205) - dVar205;
                      if (dVar198 <= 1e-13) {
                        dVar203 = 1.0;
                        if ((dVar198 < -1e-13) &&
                           (dVar203 = (dVar201 - dVar205) / dVar198, 1.0 <= dVar203)) {
                          dVar203 = 1.0;
                        }
                      }
                      else {
                        dVar203 = ((double)CONCAT44(uVar214,uVar212) - dVar205) / dVar198;
                        if (1.0 <= dVar203) {
                          dVar203 = 1.0;
                        }
                      }
                      if (dVar200 <= dVar203) {
                        dVar203 = dVar200;
                      }
                    }
                    dVar200 = dVar203;
                    if ((uVar30 >> 0x11 & 1) != 0) {
                      cVar153 = '\x05';
                      dVar201 = dVar205;
                      dVar200 = dVar205;
                      for (lVar100 = -1; lVar100 != 2; lVar100 = lVar100 + 1) {
                        cVar131 = cVar153;
                        for (lVar124 = -1; lVar124 != 2; lVar124 = lVar124 + 1) {
                          for (lVar158 = 0; lVar158 != 2; lVar158 = lVar158 + 1) {
                            uVar212 = SUB84(dVar200,0);
                            uVar214 = (undefined4)((ulong)dVar200 >> 0x20);
                            dVar198 = dVar201;
                            if (((int)lVar158 != 1 || ((int)lVar124 != 0 || (int)lVar100 != 0)) &&
                               ((1 << (cVar131 + (char)lVar158 & 0x1fU) & uVar30) != 0)) {
                              dVar198 = pdVar33[lVar111 + (iVar109 + (int)lVar100) * lVar35 +
                                                          (iVar133 + (int)lVar124) * lVar34 +
                                                          (long)(iVar81 + (int)lVar158)];
                              uVar213 = SUB84(dVar198,0);
                              uVar215 = (int)((ulong)dVar198 >> 0x20);
                              if (dVar198 <= dVar200) {
                                uVar213 = uVar212;
                                uVar215 = uVar214;
                              }
                              uVar212 = uVar213;
                              uVar214 = uVar215;
                              if (dVar201 <= dVar198) {
                                dVar198 = dVar201;
                              }
                            }
                            dVar201 = dVar198;
                            dVar200 = (double)CONCAT44(uVar214,uVar212);
                          }
                          cVar131 = cVar131 + '\x03';
                        }
                        cVar153 = cVar153 + '\t';
                      }
                      dVar198 = (((pdVar56 + lVar118 + lVar149 + (lVar126 - iVar21))[lVar59] -
                                 dVar195) * dVar190 +
                                (pdVar56[lVar118 + lVar149 + (lVar126 - iVar21)] - dVar193) *
                                dVar186 + (dVar205 - (dVar188 + 0.5) * dVar209)) - dVar205;
                      if (dVar198 <= 1e-13) {
                        dVar200 = 1.0;
                        if (dVar198 < -1e-13) {
                          dVar200 = (dVar201 - dVar205) / dVar198;
                          if (1.0 <= dVar200) {
                            dVar200 = 1.0;
                          }
                        }
                      }
                      else {
                        dVar200 = (dVar200 - dVar205) / dVar198;
                        if (1.0 <= dVar200) {
                          dVar200 = 1.0;
                        }
                      }
                      if (dVar203 <= dVar200) {
                        dVar200 = dVar203;
                      }
                    }
                    dVar203 = dVar200;
                    if ((uVar30 >> 0x1b & 1) != 0) {
                      cVar153 = '\x0e';
                      dVar203 = dVar205;
                      dVar201 = dVar205;
                      for (lVar100 = 0; lVar100 != 2; lVar100 = lVar100 + 1) {
                        cVar131 = cVar153;
                        for (lVar124 = -1; lVar124 != 2; lVar124 = lVar124 + 1) {
                          for (lVar158 = 0; lVar158 != 3; lVar158 = lVar158 + 1) {
                            dVar198 = dVar201;
                            if (((int)lVar158 != 1 || ((int)lVar124 != 0 || (int)lVar100 != 0)) &&
                               ((1 << (cVar131 + (char)lVar158 & 0x1fU) & uVar30) != 0)) {
                              dVar198 = pdVar33[lVar111 + (iVar109 + (int)lVar100) * lVar35 +
                                                          (iVar133 + (int)lVar124) * lVar34 +
                                                          (long)(iVar81 + (int)lVar158)];
                              dVar199 = dVar198;
                              if (dVar198 <= dVar203) {
                                dVar199 = dVar203;
                              }
                              dVar203 = dVar199;
                              if (dVar201 <= dVar198) {
                                dVar198 = dVar201;
                              }
                            }
                            dVar201 = dVar198;
                          }
                          cVar131 = cVar131 + '\x03';
                        }
                        cVar153 = cVar153 + '\t';
                      }
                      dVar198 = ((0.5 - dVar195) * dVar190 +
                                ((pdVar64 + lVar150 + lVar155 + (lVar126 - lVar176))[lVar67] -
                                dVar193) * dVar186 +
                                (pdVar64[lVar150 + lVar155 + (lVar126 - lVar176)] - dVar188) *
                                dVar209 + dVar205) - dVar205;
                      if (dVar198 <= 1e-13) {
                        dVar203 = 1.0;
                        if ((dVar198 < -1e-13) &&
                           (dVar203 = (dVar201 - dVar205) / dVar198, 1.0 <= dVar203)) {
                          dVar203 = 1.0;
                        }
                      }
                      else {
                        dVar203 = (dVar203 - dVar205) / dVar198;
                        if (1.0 <= dVar203) {
                          dVar203 = 1.0;
                        }
                      }
                      if (dVar200 <= dVar203) {
                        dVar203 = dVar200;
                      }
                    }
                    dVar200 = dVar203;
                    if ((uVar30 >> 9 & 1) != 0) {
                      cVar153 = '\x05';
                      dVar200 = dVar205;
                      dVar201 = dVar205;
                      for (lVar100 = -1; lVar100 != 1; lVar100 = lVar100 + 1) {
                        cVar131 = cVar153;
                        for (lVar124 = -1; lVar124 != 2; lVar124 = lVar124 + 1) {
                          for (lVar158 = 0; lVar158 != 3; lVar158 = lVar158 + 1) {
                            dVar198 = dVar201;
                            if (((int)lVar158 != 1 || ((int)lVar124 != 0 || (int)lVar100 != 0)) &&
                               ((1 << (cVar131 + (char)lVar158 & 0x1fU) & uVar30) != 0)) {
                              dVar198 = pdVar33[lVar111 + (iVar109 + (int)lVar100) * lVar35 +
                                                          (iVar133 + (int)lVar124) * lVar34 +
                                                          (long)(iVar81 + (int)lVar158)];
                              dVar199 = dVar198;
                              if (dVar198 <= dVar200) {
                                dVar199 = dVar200;
                              }
                              dVar200 = dVar199;
                              if (dVar201 <= dVar198) {
                                dVar198 = dVar201;
                              }
                            }
                            dVar201 = dVar198;
                          }
                          cVar131 = cVar131 + '\x03';
                        }
                        cVar153 = cVar153 + '\t';
                      }
                      dVar198 = ((((pdVar64 + lVar150 + lVar156 + (lVar126 - lVar176))[lVar67] -
                                  dVar193) * dVar186 +
                                 (pdVar64[lVar150 + lVar156 + (lVar126 - lVar176)] - dVar188) *
                                 dVar209 + dVar205) - (dVar195 + 0.5) * dVar190) - dVar205;
                      if (dVar198 <= 1e-13) {
                        dVar200 = 1.0;
                        if ((dVar198 < -1e-13) &&
                           (dVar200 = (dVar201 - dVar205) / dVar198, 1.0 <= dVar200)) {
                          dVar200 = 1.0;
                        }
                      }
                      else {
                        dVar200 = (dVar200 - dVar205) / dVar198;
                        if (1.0 <= dVar200) {
                          dVar200 = 1.0;
                        }
                      }
                      if (dVar203 <= dVar200) {
                        dVar200 = dVar203;
                      }
                    }
                    dVar203 = 0.0;
                    if (1 < iVar159) {
                      dVar203 = dVar200;
                    }
                    dVar201 = 0.0;
                    if (1 < iVar179) {
                      dVar201 = dVar200;
                    }
                    dVar198 = 0.0;
                    if (1 < iVar160) {
                      dVar198 = dVar200;
                    }
                    if ((dVar202 != 1.0) || (NAN(dVar202))) {
                      dVar200 = pdVar51[lVar94 + lVar129 + lVar122];
                    }
                    else {
                      if ((((pdVar51[lVar93 + lVar129 + (int)(~uVar17 + iVar141)] == 1.0) &&
                           (!NAN(pdVar51[lVar93 + lVar129 + (int)(~uVar17 + iVar141)]))) &&
                          (pdVar51[lVar93 + lVar129 + (int)((iVar141 - uVar17) + 1)] == 1.0)) &&
                         (!NAN(pdVar51[lVar93 + lVar129 + (int)((iVar141 - uVar17) + 1)]))) {
                        dVar203 = 1.0;
                      }
                      dVar200 = pdVar51[lVar94 + lVar129 + lVar122];
                      if (((dVar200 == 1.0) && (!NAN(dVar200))) &&
                         ((pdVar51[lVar129 + lVar151 + lVar122] == 1.0 &&
                          (!NAN(pdVar51[lVar129 + lVar151 + lVar122]))))) {
                        dVar201 = 1.0;
                      }
                      if (((pdVar51[lVar93 + lVar122 + lVar119] == 1.0) &&
                          (!NAN(pdVar51[lVar93 + lVar122 + lVar119]))) &&
                         ((pdVar51[lVar93 + lVar122 + lVar120] == 1.0 &&
                          (!NAN(pdVar51[lVar93 + lVar122 + lVar120]))))) {
                        dVar198 = 1.0;
                      }
                    }
                    dVar193 = (local_9b0 - dVar195) * dVar190 * dVar198 +
                              (local_9b8 - dVar188) * dVar209 * dVar203 +
                              -(dVar193 + 0.5) * dVar186 * dVar201 + dVar205;
                    if (dVar193 <= dVar187) {
                      dVar187 = dVar193;
                    }
                    if (dVar208 <= dVar187) {
                      dVar208 = dVar187;
                    }
                    dVar208 = pdVar37[lVar178 + lVar136 + (lVar126 - lVar163)] * dVar184 * -0.5 *
                              dVar186 * dVar201 + dVar208;
                    local_a00 = pdVar51 + lVar94 + lVar122;
                    if ((dVar200 == 1.0) && (!NAN(dVar200))) goto LAB_00408819;
                    bVar82 = false;
LAB_00408c20:
                    pdVar101 = pdVar54 + (iVar86 - iVar172) * lVar31 +
                                         iVar87 * lVar55 + (long)(int)(iVar141 - uVar9);
                    dVar188 = pdVar101[lVar32];
                    dVar195 = *pdVar101;
                    dVar205 = pdVar101[lVar32 * 2];
                    dVar187 = pdVar33[lVar97 + lVar114 + lVar111 + lVar123];
                    dVar209 = pdVar33[lVar98 + lVar123 + lVar114 + lVar111];
                    uVar30 = pEVar48[lVar106 + (lVar2 - lVar127) * lVar49 + lVar121].flag;
                    iVar159 = 0;
                    cVar153 = '\x05';
                    for (lVar121 = -1; lVar121 != 2; lVar121 = lVar121 + 1) {
                      iVar104 = (int)lVar121;
                      iVar154 = iVar159;
                      cVar131 = cVar153;
                      for (lVar100 = -1; iVar154 = iVar154 + 3, lVar100 != 2; lVar100 = lVar100 + 1)
                      {
                        lVar158 = (long)iVar159;
                        paRVar125 = A + lVar158;
                        iVar160 = (int)lVar100;
                        iVar159 = iVar159 + 3;
                        for (lVar124 = 0; iVar154 - lVar158 != lVar124; lVar124 = lVar124 + 1) {
                          iVar179 = (int)lVar124 + -1;
                          if (((iVar160 == 0 && iVar104 == 0) && iVar179 == 0) ||
                             ((1 << (cVar131 + (char)lVar124 & 0x1fU) & uVar30) == 0)) {
                            (*paRVar125)[0] = 0.0;
                            (*paRVar125)[1] = 0.0;
                            (*paRVar125)[2] = 0.0;
                          }
                          else {
                            pdVar101 = pdVar54 + ((iVar86 - iVar172) + iVar104) * lVar31 +
                                                 (iVar87 + iVar160) * lVar55 +
                                                 (long)(int)(~uVar9 + iVar141 + (int)lVar124);
                            dVar193 = pdVar101[lVar32];
                            (*paRVar125)[0] = (*pdVar101 + (double)iVar179) - dVar195;
                            (*paRVar125)[1] = (dVar193 + (double)iVar160) - dVar188;
                            (*paRVar125)[2] = (pdVar101[lVar32 * 2] + (double)iVar104) - dVar205;
                          }
                          paRVar125 = paRVar125 + 1;
                        }
                        cVar131 = cVar131 + '\x03';
                      }
                      cVar153 = cVar153 + '\t';
                    }
                    iVar159 = 0;
                    cVar153 = '\x05';
                    for (lVar121 = -1; lVar121 != 2; lVar121 = lVar121 + 1) {
                      iVar154 = iVar159;
                      cVar131 = cVar153;
                      for (lVar100 = -1; iVar154 = iVar154 + 3, lVar100 != 2; lVar100 = lVar100 + 1)
                      {
                        lVar124 = (long)iVar159;
                        iVar159 = iVar159 + 3;
                        for (lVar158 = 0; iVar154 - lVar124 != lVar158; lVar158 = lVar158 + 1) {
                          RVar185 = 0.0;
                          if (((int)lVar158 != 1 || ((int)lVar100 != 0 || (int)lVar121 != 0)) &&
                             ((1 << (cVar131 + (char)lVar158 & 0x1fU) & uVar30) != 0)) {
                            RVar185 = pdVar33[lVar111 + (iVar109 + (int)lVar121) * lVar35 +
                                                        (iVar88 + (int)lVar100) * lVar34 +
                                                        (long)(iVar142 + -1 + (int)lVar158)] -
                                      dVar209;
                          }
                          du[lVar124 + lVar158] = RVar185;
                        }
                        cVar131 = cVar131 + '\x03';
                      }
                      cVar153 = cVar153 + '\t';
                    }
                    pdVar101 = &local_418;
                    for (lVar121 = 0; lVar121 != 3; lVar121 = lVar121 + 1) {
                      for (lVar100 = -0x48; lVar100 != 0; lVar100 = lVar100 + 0x18) {
                        *(undefined8 *)((long)pdVar101 + lVar100 + 0x48) = 0;
                      }
                      local_708[lVar121] = 0.0;
                      pdVar101 = pdVar101 + 1;
                    }
                    pRVar102 = A[0] + 1;
                    dVar193 = local_3f8;
                    dVar186 = local_3d8;
                    dVar190 = local_708[0];
                    dVar203 = local_418;
                    dVar201 = local_408;
                    dVar198 = dStack_3f0;
                    dVar199 = local_410;
                    dVar191 = local_708[1];
                    dVar204 = local_708[2];
                    for (lVar121 = 0; lVar121 != 0x1b; lVar121 = lVar121 + 1) {
                      dVar207 = (*(Real (*) [3])(pRVar102 + -1))[0];
                      dVar206 = *pRVar102;
                      dVar210 = pRVar102[1];
                      dVar211 = du[lVar121];
                      dVar201 = dVar201 + dVar210 * dVar207;
                      dVar198 = dVar198 + dVar210 * dVar206;
                      dVar199 = dVar199 + dVar206 * dVar207;
                      dVar193 = dVar193 + dVar206 * dVar206;
                      dVar186 = dVar186 + dVar210 * dVar210;
                      dVar190 = dVar190 + dVar207 * dVar211;
                      dVar203 = dVar203 + dVar207 * dVar207;
                      dVar191 = dVar191 + dVar211 * dVar206;
                      dVar204 = dVar204 + dVar211 * dVar210;
                      pRVar102 = pRVar102 + 3;
                    }
                    dVar206 = dVar186 * dVar199 - dVar201 * dVar198;
                    dVar207 = dVar204 * dVar199 - dVar201 * dVar191;
                    dVar210 = dVar199 * dVar198 + dVar201 * -dVar193;
                    dVar211 = dVar186 * dVar193 - dVar198 * dVar198;
                    dVar186 = dVar191 * dVar186 - dVar198 * dVar204;
                    auVar194._0_8_ =
                         dVar201 * (dVar191 * dVar198 - dVar204 * dVar193) +
                         (dVar190 * dVar211 - dVar186 * dVar199);
                    auVar194._8_8_ = dVar201 * dVar207 + (dVar203 * dVar186 - dVar206 * dVar190);
                    dVar201 = dVar210 * dVar201 + (dVar211 * dVar203 - dVar206 * dVar199);
                    auVar189._8_8_ = dVar201;
                    auVar189._0_8_ = dVar201;
                    auVar197 = divpd(auVar194,auVar189);
                    dVar201 = (dVar210 * dVar190 +
                              ((dVar204 * dVar193 + -dVar191 * dVar198) * dVar203 -
                              dVar207 * dVar199)) / dVar201;
                    dVar186 = auVar197._0_8_;
                    dVar190 = auVar197._8_8_;
                    if (bVar82) {
                      if ((pdVar51[lVar94 + lVar129 + ((lVar126 + -1) - lVar128)] == 1.0) &&
                         (!NAN(pdVar51[lVar94 + lVar129 + ((lVar126 + -1) - lVar128)]))) {
                        if ((pdVar51[lVar94 + lVar129 + ((lVar126 + 1) - lVar128)] == 1.0) &&
                           (!NAN(pdVar51[lVar94 + lVar129 + ((lVar126 + 1) - lVar128)]))) {
                          dVar203 = dVar209 - pdVar33[lVar98 + lVar114 + lVar111 + ((lVar126 + -1) -
                                                                                   lVar135)];
                          dVar198 = pdVar33[lVar98 + lVar114 + lVar111 + ((lVar126 + 1) - lVar135)]
                                    - dVar209;
                          dVar203 = dVar203 + dVar203;
                          dVar198 = dVar198 + dVar198;
                          dVar193 = (pdVar33[lVar98 + lVar114 + lVar111 + ((lVar126 + 1) - lVar135)]
                                    - pdVar33[lVar98 + lVar114 + lVar111 + ((lVar126 + -1) - lVar135
                                                                           )]) * 0.5;
                          dVar199 = ABS(dVar203);
                          uVar183 = -(ulong)(0.0 < dVar193);
                          dVar193 = ABS(dVar193);
                          dVar186 = ABS(dVar198);
                          if (dVar199 <= dVar193) {
                            dVar193 = dVar199;
                          }
                          if (dVar193 <= dVar186) {
                            dVar186 = dVar193;
                          }
                          uVar192 = -(ulong)(0.0 < dVar203 * dVar198) & (ulong)dVar186;
                          dVar186 = (double)(~uVar183 & (uVar192 ^ 0x8000000000000000) |
                                            uVar183 & uVar192);
                        }
                      }
                      if ((((dVar202 == 1.0) && (!NAN(dVar202))) &&
                          (pdVar51[lVar129 + lVar95 + lVar122] == 1.0)) &&
                         (!NAN(pdVar51[lVar129 + lVar95 + lVar122]))) {
                        dVar198 = dVar209 - pdVar33[lVar139 + lVar114 + lVar111 + lVar123];
                        dVar203 = (dVar187 - dVar209) + (dVar187 - dVar209);
                        dVar198 = dVar198 + dVar198;
                        dVar193 = (dVar187 - pdVar33[lVar139 + lVar114 + lVar111 + lVar123]) * 0.5;
                        dVar199 = ABS(dVar198);
                        uVar183 = -(ulong)(0.0 < dVar193);
                        dVar193 = ABS(dVar193);
                        dVar190 = ABS(dVar203);
                        if (dVar199 <= dVar193) {
                          dVar193 = dVar199;
                        }
                        if (dVar193 <= dVar190) {
                          dVar190 = dVar193;
                        }
                        uVar192 = -(ulong)(0.0 < dVar198 * dVar203) & (ulong)dVar190;
                        dVar190 = (double)(~uVar183 & (uVar192 ^ 0x8000000000000000) |
                                          uVar183 & uVar192);
                      }
                      if (((local_a00[lVar115] == 1.0) && (!NAN(local_a00[lVar115]))) &&
                         ((local_a00[lVar116] == 1.0 && (!NAN(local_a00[lVar116]))))) {
                        dVar198 = dVar209 - pdVar33[lVar98 + lVar123 + lVar170 + lVar111];
                        dVar199 = pdVar33[lVar98 + lVar123 + lVar117 + lVar111] - dVar209;
                        dVar198 = dVar198 + dVar198;
                        dVar199 = dVar199 + dVar199;
                        dVar203 = (pdVar33[lVar98 + lVar123 + lVar117 + lVar111] -
                                  pdVar33[lVar98 + lVar123 + lVar170 + lVar111]) * 0.5;
                        dVar201 = ABS(dVar198);
                        uVar183 = -(ulong)(0.0 < dVar203);
                        dVar203 = ABS(dVar203);
                        dVar193 = ABS(dVar199);
                        if (dVar201 <= dVar203) {
                          dVar203 = dVar201;
                        }
                        if (dVar203 <= dVar193) {
                          dVar193 = dVar203;
                        }
                        uVar192 = -(ulong)(0.0 < dVar198 * dVar199) & (ulong)dVar193;
                        dVar201 = (double)(~uVar183 & (uVar192 ^ 0x8000000000000000) |
                                          uVar183 & uVar192);
                      }
                    }
                    dVar193 = dVar209;
                    if (dVar187 <= dVar209) {
                      dVar193 = dVar187;
                    }
                    dVar203 = dVar209;
                    if (dVar209 <= dVar187) {
                      dVar203 = dVar187;
                    }
                    iVar104 = 0;
                    iVar160 = 0;
                    iVar179 = 0;
                    iVar159 = 0;
                    iVar154 = -1;
                    while (iVar154 != 2) {
                      iVar134 = iVar104;
                      iVar110 = -1;
                      while (iVar110 != 2) {
                        for (iVar171 = 5; iVar171 != 8; iVar171 = iVar171 + 1) {
                          if (((uVar30 >> (iVar134 + iVar171 & 0x1fU) & 1) != 0) &&
                             ((iVar171 != 6 || iVar110 != 0) || iVar154 != 0)) {
                            iVar159 = iVar159 + (uint)((iVar171 - 5U & 0xfffffffd) == 0 &&
                                                      (iVar110 == 0 && iVar154 == 0));
                            iVar179 = iVar179 + (uint)((iVar171 == 6 && iVar154 == 0) &&
                                                      (iVar110 == 1 || iVar110 + 1 == 0));
                            iVar160 = iVar160 + (uint)((iVar171 == 6 && iVar110 == 0) &&
                                                      (iVar154 == 1 || iVar154 + 1 == 0));
                          }
                        }
                        iVar134 = iVar134 + 3;
                        iVar110 = iVar110 + 1;
                      }
                      iVar104 = iVar104 + 9;
                      iVar154 = iVar154 + 1;
                    }
                    dVar187 = 2.0;
                    if ((uVar30 >> 0x15 & 1) != 0) {
                      cVar153 = '\b';
                      dVar198 = dVar209;
                      dVar187 = dVar209;
                      for (lVar121 = -1; lVar121 != 2; lVar121 = lVar121 + 1) {
                        cVar131 = cVar153;
                        for (lVar100 = 0; lVar100 != 2; lVar100 = lVar100 + 1) {
                          for (lVar123 = 0; lVar123 != 3; lVar123 = lVar123 + 1) {
                            if (((int)lVar123 != 1 || ((int)lVar100 != 0 || (int)lVar121 != 0)) &&
                               ((1 << (cVar131 + (char)lVar123 & 0x1fU) & uVar30) != 0)) {
                              dVar199 = pdVar33[lVar111 + (iVar109 + (int)lVar121) * lVar35 +
                                                          (iVar88 + (int)lVar100) * lVar34 +
                                                          (long)(iVar142 + -1 + (int)lVar123)];
                              dVar191 = dVar199;
                              if (dVar199 <= dVar187) {
                                dVar191 = dVar187;
                              }
                              dVar187 = dVar191;
                              if (dVar199 < dVar198) {
                                dVar198 = dVar199;
                              }
                            }
                          }
                          cVar131 = cVar131 + '\x03';
                        }
                        cVar153 = cVar153 + '\t';
                      }
                      dVar199 = ((local_9b0 - dVar205) * dVar201 +
                                (0.5 - dVar188) * dVar190 +
                                (local_9b8 - dVar195) * dVar186 + dVar209) - dVar209;
                      if (dVar199 <= 1e-13) {
                        dVar187 = 1.0;
                        if ((dVar199 < -1e-13) &&
                           (dVar187 = (dVar198 - dVar209) / dVar199, 1.0 <= dVar187)) {
                          dVar187 = 1.0;
                        }
                      }
                      else {
                        dVar187 = (dVar187 - dVar209) / dVar199;
                        if (1.0 <= dVar187) {
                          dVar187 = 1.0;
                        }
                      }
                      if (2.0 <= dVar187) {
                        dVar187 = 2.0;
                      }
                    }
                    dVar198 = dVar187;
                    if ((short)uVar30 < 0) {
                      cVar153 = '\x05';
                      dVar199 = dVar209;
                      dVar198 = dVar209;
                      for (lVar121 = -1; lVar121 != 2; lVar121 = lVar121 + 1) {
                        cVar131 = cVar153;
                        for (lVar100 = -1; lVar100 != 1; lVar100 = lVar100 + 1) {
                          for (lVar123 = -1; lVar123 != 2; lVar123 = lVar123 + 1) {
                            if ((((int)lVar100 != 0 || (int)lVar121 != 0) || (int)lVar123 != 0) &&
                               ((1 << (cVar131 + (char)lVar123 + 1U & 0x1f) & uVar30) != 0)) {
                              dVar191 = pdVar33[lVar111 + (iVar109 + (int)lVar121) * lVar35 +
                                                          (iVar88 + (int)lVar100) * lVar34 +
                                                          (long)(int)(-uVar10 + iVar141 +
                                                                     (int)lVar123)];
                              dVar204 = dVar191;
                              if (dVar191 <= dVar198) {
                                dVar204 = dVar198;
                              }
                              dVar198 = dVar204;
                              if (dVar191 < dVar199) {
                                dVar199 = dVar191;
                              }
                            }
                          }
                          cVar131 = cVar131 + '\x03';
                        }
                        cVar153 = cVar153 + '\t';
                      }
                      dVar191 = pdVar33[lVar98 + lVar114 + lVar111 + (int)(iVar141 - uVar10)];
                      dVar209 = (((pdVar60 + lVar112 + (lVar2 - iVar23) * lVar61 + local_8b0)
                                  [lVar63] - dVar205) * dVar201 +
                                (((pdVar60[lVar112 + (lVar2 - iVar23) * lVar61 + local_8b0] -
                                  dVar195) * dVar186 + dVar209) - (dVar188 + 0.5) * dVar190)) -
                                dVar191;
                      if (dVar209 <= 1e-13) {
                        dVar198 = 1.0;
                        if ((dVar209 < -1e-13) &&
                           (dVar198 = (dVar199 - dVar191) / dVar209, 1.0 <= dVar198)) {
                          dVar198 = 1.0;
                        }
                      }
                      else {
                        dVar198 = (dVar198 - dVar191) / dVar209;
                        if (1.0 <= dVar198) {
                          dVar198 = 1.0;
                        }
                      }
                      if (dVar187 <= dVar198) {
                        dVar198 = dVar187;
                      }
                    }
                    dVar187 = dVar198;
                    if ((uVar30 >> 0x13 & 1) != 0) {
                      dVar209 = pdVar33[lVar98 + lVar114 + lVar111 + (int)(iVar141 - uVar10)];
                      cVar153 = '\x06';
                      uVar212 = SUB84(dVar209,0);
                      uVar214 = (undefined4)((ulong)dVar209 >> 0x20);
                      dVar187 = dVar209;
                      for (lVar121 = -1; lVar121 != 2; lVar121 = lVar121 + 1) {
                        cVar131 = cVar153;
                        for (lVar100 = -1; lVar100 != 2; lVar100 = lVar100 + 1) {
                          for (lVar123 = 0; lVar123 != 2; lVar123 = lVar123 + 1) {
                            if ((((int)lVar100 == 0 && (int)lVar121 == 0) && (int)lVar123 == 0) ||
                               ((1 << (cVar131 + (char)lVar123 & 0x1fU) & uVar30) == 0)) {
                              dVar199 = (double)CONCAT44(uVar214,uVar212);
                            }
                            else {
                              dVar199 = pdVar33[lVar111 + (iVar109 + (int)lVar121) * lVar35 +
                                                          (iVar88 + (int)lVar100) * lVar34 +
                                                          (long)(int)(-uVar10 + iVar141 +
                                                                     (int)lVar123)];
                              dVar191 = dVar199;
                              if (dVar199 <= dVar187) {
                                dVar191 = dVar187;
                              }
                              dVar187 = dVar191;
                              if ((double)CONCAT44(uVar214,uVar212) < dVar199 ||
                                  (double)CONCAT44(uVar214,uVar212) == dVar199) {
                                dVar199 = (double)CONCAT44(uVar214,uVar212);
                              }
                            }
                            uVar212 = SUB84(dVar199,0);
                            uVar214 = (undefined4)((ulong)dVar199 >> 0x20);
                          }
                          cVar131 = cVar131 + '\x03';
                        }
                        cVar153 = cVar153 + '\t';
                      }
                      dVar199 = (((pdVar56 + lVar118 + lVar99 + ((iVar141 - iVar21) + 1))[lVar59] -
                                 dVar205) * dVar201 +
                                (pdVar56[lVar118 + lVar99 + ((iVar141 - iVar21) + 1)] - dVar188) *
                                dVar190 + (0.5 - dVar195) * dVar186 + dVar209) - dVar209;
                      if (dVar199 <= 1e-13) {
                        dVar187 = 1.0;
                        if (dVar199 < -1e-13) {
                          dVar187 = ((double)CONCAT44(uVar214,uVar212) - dVar209) / dVar199;
                          if (1.0 <= dVar187) {
                            dVar187 = 1.0;
                          }
                        }
                      }
                      else {
                        dVar187 = (dVar187 - dVar209) / dVar199;
                        if (1.0 <= dVar187) {
                          dVar187 = 1.0;
                        }
                      }
                      if (dVar198 <= dVar187) {
                        dVar187 = dVar198;
                      }
                    }
                    dVar209 = dVar187;
                    if ((uVar30 >> 0x11 & 1) != 0) {
                      dVar198 = pdVar33[lVar98 + lVar114 + lVar111 + (int)(iVar141 - uVar10)];
                      cVar153 = '\x05';
                      uVar212 = SUB84(dVar198,0);
                      uVar214 = (undefined4)((ulong)dVar198 >> 0x20);
                      dVar209 = dVar198;
                      for (lVar121 = -1; lVar121 != 2; lVar121 = lVar121 + 1) {
                        cVar131 = cVar153;
                        for (lVar100 = -1; lVar100 != 2; lVar100 = lVar100 + 1) {
                          for (lVar123 = 0; lVar123 != 2; lVar123 = lVar123 + 1) {
                            if (((int)lVar123 == 1 && ((int)lVar100 == 0 && (int)lVar121 == 0)) ||
                               ((1 << (cVar131 + (char)lVar123 & 0x1fU) & uVar30) == 0)) {
                              dVar199 = (double)CONCAT44(uVar214,uVar212);
                            }
                            else {
                              dVar199 = pdVar33[lVar111 + (iVar109 + (int)lVar121) * lVar35 +
                                                          (iVar88 + (int)lVar100) * lVar34 +
                                                          (long)(int)(uVar132 + iVar141 +
                                                                     (int)lVar123)];
                              dVar191 = dVar199;
                              if (dVar199 <= dVar209) {
                                dVar191 = dVar209;
                              }
                              dVar209 = dVar191;
                              if ((double)CONCAT44(uVar214,uVar212) < dVar199 ||
                                  (double)CONCAT44(uVar214,uVar212) == dVar199) {
                                dVar199 = (double)CONCAT44(uVar214,uVar212);
                              }
                            }
                            uVar212 = SUB84(dVar199,0);
                            uVar214 = (undefined4)((ulong)dVar199 >> 0x20);
                          }
                          cVar131 = cVar131 + '\x03';
                        }
                        cVar153 = cVar153 + '\t';
                      }
                      dVar199 = (((pdVar56 + lVar118 + lVar99 + (lVar126 - iVar21))[lVar59] -
                                 dVar205) * dVar201 +
                                (pdVar56[lVar118 + lVar99 + (lVar126 - iVar21)] - dVar188) * dVar190
                                + (dVar198 - (dVar195 + 0.5) * dVar186)) - dVar198;
                      if (dVar199 <= 1e-13) {
                        dVar209 = 1.0;
                        if (dVar199 < -1e-13) {
                          dVar209 = ((double)CONCAT44(uVar214,uVar212) - dVar198) / dVar199;
                          if (1.0 <= dVar209) {
                            dVar209 = 1.0;
                          }
                        }
                      }
                      else {
                        dVar209 = (dVar209 - dVar198) / dVar199;
                        if (1.0 <= dVar209) {
                          dVar209 = 1.0;
                        }
                      }
                      if (dVar187 <= dVar209) {
                        dVar209 = dVar187;
                      }
                    }
                    dVar187 = dVar209;
                    if ((uVar30 >> 0x1b & 1) != 0) {
                      dVar198 = pdVar33[lVar98 + lVar114 + lVar111 + (int)(iVar141 - uVar10)];
                      cVar153 = '\x0e';
                      uVar212 = SUB84(dVar198,0);
                      uVar214 = (undefined4)((ulong)dVar198 >> 0x20);
                      dVar187 = dVar198;
                      for (lVar121 = 0; lVar121 != 2; lVar121 = lVar121 + 1) {
                        cVar131 = cVar153;
                        for (lVar100 = -1; lVar100 != 2; lVar100 = lVar100 + 1) {
                          for (lVar123 = 0; lVar123 != 3; lVar123 = lVar123 + 1) {
                            if (((int)lVar123 == 1 && ((int)lVar100 == 0 && (int)lVar121 == 0)) ||
                               ((1 << (cVar131 + (char)lVar123 & 0x1fU) & uVar30) == 0)) {
                              dVar199 = (double)CONCAT44(uVar214,uVar212);
                            }
                            else {
                              dVar199 = pdVar33[lVar111 + (iVar109 + (int)lVar121) * lVar35 +
                                                          (iVar88 + (int)lVar100) * lVar34 +
                                                          (long)(int)(uVar132 + iVar141 +
                                                                     (int)lVar123)];
                              dVar191 = dVar199;
                              if (dVar199 <= dVar187) {
                                dVar191 = dVar187;
                              }
                              dVar187 = dVar191;
                              if ((double)CONCAT44(uVar214,uVar212) < dVar199 ||
                                  (double)CONCAT44(uVar214,uVar212) == dVar199) {
                                dVar199 = (double)CONCAT44(uVar214,uVar212);
                              }
                            }
                            uVar212 = SUB84(dVar199,0);
                            uVar214 = (undefined4)((ulong)dVar199 >> 0x20);
                          }
                          cVar131 = cVar131 + '\x03';
                        }
                        cVar153 = cVar153 + '\t';
                      }
                      dVar199 = ((0.5 - dVar205) * dVar201 +
                                ((pdVar64 + lVar157 + lVar155 + (lVar126 - lVar176))[lVar67] -
                                dVar188) * dVar190 +
                                (pdVar64[lVar157 + lVar155 + (lVar126 - lVar176)] - dVar195) *
                                dVar186 + dVar198) - dVar198;
                      if (dVar199 <= 1e-13) {
                        dVar187 = 1.0;
                        if (dVar199 < -1e-13) {
                          dVar187 = ((double)CONCAT44(uVar214,uVar212) - dVar198) / dVar199;
                          if (1.0 <= dVar187) {
                            dVar187 = 1.0;
                          }
                        }
                      }
                      else {
                        dVar187 = (dVar187 - dVar198) / dVar199;
                        if (1.0 <= dVar187) {
                          dVar187 = 1.0;
                        }
                      }
                      if (dVar209 <= dVar187) {
                        dVar187 = dVar209;
                      }
                    }
                    dVar209 = dVar187;
                    if ((uVar30 >> 9 & 1) != 0) {
                      dVar198 = pdVar33[lVar98 + lVar114 + lVar111 + (int)(iVar141 - uVar10)];
                      cVar153 = '\x05';
                      uVar212 = SUB84(dVar198,0);
                      uVar214 = (undefined4)((ulong)dVar198 >> 0x20);
                      dVar209 = dVar198;
                      for (lVar121 = -1; lVar121 != 1; lVar121 = lVar121 + 1) {
                        cVar131 = cVar153;
                        for (lVar100 = -1; lVar100 != 2; lVar100 = lVar100 + 1) {
                          for (lVar123 = 0; lVar123 != 3; lVar123 = lVar123 + 1) {
                            if (((int)lVar123 == 1 && ((int)lVar100 == 0 && (int)lVar121 == 0)) ||
                               ((1 << (cVar131 + (char)lVar123 & 0x1fU) & uVar30) == 0)) {
                              dVar199 = (double)CONCAT44(uVar214,uVar212);
                            }
                            else {
                              dVar199 = pdVar33[lVar111 + (iVar109 + (int)lVar121) * lVar35 +
                                                          (iVar88 + (int)lVar100) * lVar34 +
                                                          (long)(int)(uVar132 + iVar141 +
                                                                     (int)lVar123)];
                              dVar191 = dVar199;
                              if (dVar199 <= dVar209) {
                                dVar191 = dVar209;
                              }
                              dVar209 = dVar191;
                              if ((double)CONCAT44(uVar214,uVar212) < dVar199 ||
                                  (double)CONCAT44(uVar214,uVar212) == dVar199) {
                                dVar199 = (double)CONCAT44(uVar214,uVar212);
                              }
                            }
                            uVar212 = SUB84(dVar199,0);
                            uVar214 = (undefined4)((ulong)dVar199 >> 0x20);
                          }
                          cVar131 = cVar131 + '\x03';
                        }
                        cVar153 = cVar153 + '\t';
                      }
                      dVar199 = ((((pdVar64 + lVar157 + lVar156 + (lVar126 - lVar176))[lVar67] -
                                  dVar188) * dVar190 +
                                 (pdVar64[lVar157 + lVar156 + (lVar126 - lVar176)] - dVar195) *
                                 dVar186 + dVar198) - (dVar205 + 0.5) * dVar201) - dVar198;
                      if (dVar199 <= 1e-13) {
                        dVar209 = 1.0;
                        if (dVar199 < -1e-13) {
                          dVar209 = ((double)CONCAT44(uVar214,uVar212) - dVar198) / dVar199;
                          if (1.0 <= dVar209) {
                            dVar209 = 1.0;
                          }
                        }
                      }
                      else {
                        dVar209 = (dVar209 - dVar198) / dVar199;
                        if (1.0 <= dVar209) {
                          dVar209 = 1.0;
                        }
                      }
                      if (dVar187 <= dVar209) {
                        dVar209 = dVar187;
                      }
                    }
                    dVar187 = 0.0;
                    if (1 < iVar159) {
                      dVar187 = dVar209;
                    }
                    dVar198 = 0.0;
                    if (1 < iVar179) {
                      dVar198 = dVar209;
                    }
                    dVar199 = 0.0;
                    if (1 < iVar160) {
                      dVar199 = dVar209;
                    }
                    if ((dVar200 == 1.0) && (!NAN(dVar200))) {
                      if ((pdVar51[lVar94 + lVar129 + (int)(iVar141 + ~uVar17)] == 1.0) &&
                         (((!NAN(pdVar51[lVar94 + lVar129 + (int)(iVar141 + ~uVar17)]) &&
                           (pdVar51[lVar94 + lVar129 + (int)((iVar141 - uVar17) + 1)] == 1.0)) &&
                          (!NAN(pdVar51[lVar94 + lVar129 + (int)((iVar141 - uVar17) + 1)]))))) {
                        dVar187 = 1.0;
                      }
                      dVar198 = (double)(~-(ulong)(dVar202 == 1.0) & (ulong)dVar198 |
                                        (~-(ulong)(pdVar51[lVar129 + lVar152 + lVar122] == 1.0) &
                                         (ulong)dVar198 |
                                        -(ulong)(pdVar51[lVar129 + lVar152 + lVar122] == 1.0) &
                                        0x3ff0000000000000) & -(ulong)(dVar202 == 1.0));
                      if (((pdVar51[lVar94 + lVar122 + lVar119] == 1.0) &&
                          (!NAN(pdVar51[lVar94 + lVar122 + lVar119]))) &&
                         ((pdVar51[lVar94 + lVar122 + lVar120] == 1.0 &&
                          (!NAN(pdVar51[lVar94 + lVar122 + lVar120]))))) {
                        dVar199 = 1.0;
                      }
                    }
                    dVar202 = (local_9b0 - dVar205) * dVar201 * dVar199 +
                              (0.5 - dVar188) * dVar190 * dVar198 +
                              (local_9b8 - dVar195) * dVar186 * dVar187 +
                              pdVar33[lVar98 + lVar114 + lVar111 + (lVar126 - lVar135)];
                    if (dVar202 <= dVar203) {
                      dVar203 = dVar202;
                    }
                    if (dVar193 <= dVar203) {
                      dVar193 = dVar203;
                    }
                    dVar193 = pdVar37[lVar178 + lVar136 + (lVar126 - lVar163)] * dVar184 * -0.5 *
                              dVar190 * dVar198 + dVar193;
                  }
                  else {
                    local_a00 = pdVar51 + lVar94 + lVar122;
                    if ((local_a00[lVar129] != 1.0) || (NAN(local_a00[lVar129]))) goto LAB_00407086;
                    dVar208 = pdVar51[lVar129 + lVar96 + lVar122];
                    if ((((pdVar51[lVar129 + lVar95 + lVar122] != 1.0) ||
                         (NAN(pdVar51[lVar129 + lVar95 + lVar122]))) || (dVar208 != 1.0)) ||
                       (NAN(dVar208))) {
                      if ((dVar208 != 1.0) || (NAN(dVar208))) goto LAB_00407086;
LAB_0040a23f:
                      lVar100 = lVar126 - lVar135;
                      dVar208 = pdVar33[lVar97 + lVar143 + lVar111 + lVar100];
                      dVar205 = dVar208 - pdVar33[lVar137 + lVar143 + lVar111 + lVar100];
                      dVar187 = pdVar33[lVar138 + lVar143 + lVar111 + lVar100] - dVar208;
                      dVar205 = dVar205 + dVar205;
                      dVar187 = dVar187 + dVar187;
                      dVar193 = (pdVar33[lVar138 + lVar143 + lVar111 + lVar100] -
                                pdVar33[lVar137 + lVar143 + lVar111 + lVar100]) * 0.5;
                      dVar195 = ABS(dVar205);
                      uVar183 = -(ulong)(0.0 < dVar193);
                      dVar193 = ABS(dVar193);
                      dVar188 = ABS(dVar187);
                      if (dVar195 <= dVar193) {
                        dVar193 = dVar195;
                      }
                      if (dVar193 <= dVar188) {
                        dVar188 = dVar193;
                      }
                      uVar192 = -(ulong)(0.0 < dVar205 * dVar187) & (ulong)dVar188;
                      dVar208 = (double)(~uVar183 & (uVar192 ^ 0x8000000000000000) |
                                        uVar183 & uVar192) *
                                (-1.0 - pdVar37[lVar178 + lVar136 + (lVar126 - lVar163)] * dVar184)
                                * 0.5 + dVar208;
                    }
                    else {
                      if ((pdVar51[lVar129 + (lVar4 - lVar173) * lVar52 + lVar122] != 1.0) ||
                         (NAN(pdVar51[lVar129 + (lVar4 - lVar173) * lVar52 + lVar122])))
                      goto LAB_0040a23f;
                      lVar100 = lVar126 - lVar135;
                      dVar208 = pdVar33[lVar97 + lVar143 + lVar111 + lVar100];
                      dVar195 = dVar208 - pdVar33[lVar137 + lVar143 + lVar111 + lVar100];
                      dVar205 = pdVar33[lVar137 + lVar143 + lVar111 + lVar100] -
                                pdVar33[lVar139 + lVar143 + lVar111 + lVar100];
                      dVar188 = 0.0;
                      dVar193 = 0.0;
                      if (0.0 <= dVar195 * dVar205) {
                        dVar193 = ABS(dVar195);
                        if (ABS(dVar205) <= ABS(dVar195)) {
                          dVar193 = ABS(dVar205);
                        }
                        dVar193 = dVar193 + dVar193;
                      }
                      dVar209 = pdVar33[lVar111 + lVar143 + (lVar4 - lVar161) * lVar34 + lVar100] -
                                pdVar33[lVar138 + lVar143 + lVar111 + lVar100];
                      dVar186 = pdVar33[lVar138 + lVar143 + lVar111 + lVar100] - dVar208;
                      dVar187 = (dVar186 + dVar209) * 0.5;
                      if (0.0 <= dVar186 * dVar209) {
                        dVar188 = ABS(dVar209);
                        if (ABS(dVar186) <= ABS(dVar209)) {
                          dVar188 = ABS(dVar186);
                        }
                        dVar188 = dVar188 + dVar188;
                      }
                      dVar190 = (dVar195 + dVar186) * 0.5;
                      dVar209 = 0.0;
                      if (0.0 <= dVar195 * dVar186) {
                        dVar209 = ABS(dVar186);
                        if (ABS(dVar195) <= ABS(dVar186)) {
                          dVar209 = ABS(dVar195);
                        }
                        dVar209 = dVar209 + dVar209;
                      }
                      dVar205 = (dVar195 + dVar205) * 0.5;
                      dVar195 = ABS(dVar205);
                      if (dVar193 <= dVar195) {
                        dVar195 = dVar193;
                      }
                      dVar193 = ABS(dVar187);
                      if (dVar188 <= dVar193) {
                        dVar193 = dVar188;
                      }
                      dVar193 = ABS(dVar190 * 1.3333333333333333 +
                                    (dVar193 * (double)((ulong)dVar187 & 0x8000000000000000 |
                                                       0x3ff0000000000000) +
                                    dVar195 * (double)((ulong)dVar205 & 0x8000000000000000 |
                                                      0x3ff0000000000000)) * -0.16666666666666666);
                      if (dVar209 <= dVar193) {
                        dVar193 = dVar209;
                      }
                      dVar208 = dVar193 * (double)((ulong)dVar190 & 0x8000000000000000 |
                                                  0x3ff0000000000000) *
                                (-1.0 - pdVar37[lVar178 + lVar136 + (lVar126 - lVar163)] * dVar184)
                                * 0.5 + dVar208;
                    }
LAB_00408819:
                    dVar193 = pdVar51[lVar129 + lVar152 + lVar122];
                    if ((((dVar193 != 1.0) || (NAN(dVar193))) || (dVar202 != 1.0)) ||
                       (((NAN(dVar202) ||
                         (pdVar51[lVar129 + ((iVar103 + -3) - iVar18) * lVar52 + lVar122] != 1.0))
                        || ((NAN(pdVar51[lVar129 + ((iVar103 + -3) - iVar18) * lVar52 + lVar122]) ||
                            ((pdVar51[lVar129 + lVar151 + lVar122] != 1.0 ||
                             (NAN(pdVar51[lVar129 + lVar151 + lVar122]))))))))) {
                      if ((dVar202 != 1.0) ||
                         (((NAN(dVar202) || (dVar193 != 1.0)) || (NAN(dVar193))))) {
                        iVar142 = iVar141 - uVar10;
                        lVar123 = (long)iVar142;
                        local_8b0 = lVar126 - lVar175;
                        local_9b0 = (pdVar60 + lVar112 + lVar146 + local_8b0)[lVar63];
                        local_9b8 = pdVar60[lVar112 + lVar146 + local_8b0];
                        bVar82 = true;
                        dVar200 = 1.0;
                        goto LAB_00408c20;
                      }
                      lVar121 = lVar126 - lVar135;
                      dVar193 = pdVar33[lVar137 + lVar143 + lVar111 + lVar121];
                      dVar195 = dVar193 - pdVar33[lVar111 + lVar143 + lVar144 + lVar121];
                      dVar205 = pdVar33[lVar97 + lVar143 + lVar111 + lVar121] - dVar193;
                      dVar195 = dVar195 + dVar195;
                      dVar205 = dVar205 + dVar205;
                      dVar202 = (pdVar33[lVar97 + lVar143 + lVar111 + lVar121] -
                                pdVar33[lVar111 + lVar143 + lVar144 + lVar121]) * 0.5;
                      dVar187 = ABS(dVar195);
                      uVar183 = -(ulong)(0.0 < dVar202);
                      dVar202 = ABS(dVar202);
                      dVar188 = ABS(dVar205);
                      if (dVar187 <= dVar202) {
                        dVar202 = dVar187;
                      }
                      if (dVar202 <= dVar188) {
                        dVar188 = dVar202;
                      }
                      uVar192 = -(ulong)(0.0 < dVar195 * dVar205) & (ulong)dVar188;
                      dVar193 = (double)(~uVar183 & (uVar192 ^ 0x8000000000000000) |
                                        uVar183 & uVar192) *
                                (1.0 - pdVar37[lVar178 + lVar136 + (lVar126 - lVar163)] * dVar184) *
                                0.5 + dVar193;
                    }
                    else {
                      lVar121 = lVar126 - lVar135;
                      dVar193 = pdVar33[lVar137 + lVar143 + lVar111 + lVar121];
                      dVar195 = dVar193 - pdVar33[lVar111 + lVar143 + lVar144 + lVar121];
                      dVar205 = pdVar33[lVar111 + lVar143 + lVar144 + lVar121] -
                                pdVar33[lVar111 + lVar143 + ((iVar103 + -3) - iVar165) * lVar34 +
                                                            lVar121];
                      dVar188 = 0.0;
                      dVar202 = 0.0;
                      if (0.0 <= dVar195 * dVar205) {
                        dVar202 = ABS(dVar195);
                        if (ABS(dVar205) <= ABS(dVar195)) {
                          dVar202 = ABS(dVar205);
                        }
                        dVar202 = dVar202 + dVar202;
                      }
                      dVar187 = pdVar33[lVar111 + lVar143 + (iVar168 - iVar165) * lVar34 + lVar121]
                                - pdVar33[lVar97 + lVar143 + lVar111 + lVar121];
                      dVar186 = pdVar33[lVar97 + lVar143 + lVar111 + lVar121] - dVar193;
                      dVar209 = (dVar186 + dVar187) * 0.5;
                      if (0.0 <= dVar186 * dVar187) {
                        dVar188 = ABS(dVar187);
                        if (ABS(dVar186) <= ABS(dVar187)) {
                          dVar188 = ABS(dVar186);
                        }
                        dVar188 = dVar188 + dVar188;
                      }
                      dVar190 = (dVar195 + dVar186) * 0.5;
                      dVar187 = 0.0;
                      if (0.0 <= dVar195 * dVar186) {
                        dVar187 = ABS(dVar186);
                        if (ABS(dVar195) <= ABS(dVar186)) {
                          dVar187 = ABS(dVar195);
                        }
                        dVar187 = dVar187 + dVar187;
                      }
                      dVar205 = (dVar195 + dVar205) * 0.5;
                      dVar195 = ABS(dVar205);
                      if (dVar202 <= dVar195) {
                        dVar195 = dVar202;
                      }
                      dVar202 = ABS(dVar209);
                      if (dVar188 <= dVar202) {
                        dVar202 = dVar188;
                      }
                      dVar202 = ABS(dVar190 * 1.3333333333333333 +
                                    (dVar202 * (double)((ulong)dVar209 & 0x8000000000000000 |
                                                       0x3ff0000000000000) +
                                    dVar195 * (double)((ulong)dVar205 & 0x8000000000000000 |
                                                      0x3ff0000000000000)) * -0.16666666666666666);
                      if (dVar187 <= dVar202) {
                        dVar202 = dVar187;
                      }
                      dVar193 = dVar202 * (double)((ulong)dVar190 & 0x8000000000000000 |
                                                  0x3ff0000000000000) *
                                (1.0 - pdVar37[lVar178 + lVar136 + (lVar126 - lVar163)] * dVar184) *
                                0.5 + dVar193;
                    }
                  }
                }
                pdVar44[uVar108 * lVar47 +
                        (lVar91 - iVar15) * lVar46 +
                        (int)(~uVar14 + iVar103) * lVar45 + (lVar126 - iVar13)] = dVar193;
                pdVar40[uVar108 * lVar43 +
                        (lVar91 - iVar12) * lVar42 + lVar107 * lVar41 + (lVar126 - iVar8)] = dVar208
                ;
                lVar126 = lVar126 + 1;
                local_720 = local_720 + 1;
                local_728 = local_728 + 1;
                local_718 = local_718 + 1;
                iVar81 = iVar81 + 1;
                iVar80 = iVar80 + 1;
                lVar121 = lVar3;
              } while (iVar27 + 1 != (int)lVar126);
            }
          }
          local_870 = local_870 + lVar31;
          local_868 = local_868 + lVar31;
          local_860 = local_860 + lVar31;
          lVar91 = lVar1;
        }
        uVar108 = uVar108 + 1;
      } while( true );
    }
  }
  else {
    iVar8 = (yebox->bigend).vect[0];
  }
  A[0][0] = (Real)q->p;
  A[0][1] = (Real)q->jstride;
  A[0][2] = (Real)q->kstride;
  A[1][0] = (Real)q->nstride;
  A[1][1] = *(Real *)&q->begin;
  uVar68 = *(undefined8 *)&(q->begin).z;
  uVar69 = (q->end).y;
  A[2]._4_8_ = *(undefined8 *)&(q->end).z;
  A[1][2]._0_4_ = (undefined4)uVar68;
  A[1][2]._4_4_ = (undefined4)((ulong)uVar68 >> 0x20);
  A[2][2] = (Real)vmac->p;
  A[3][0] = (Real)vmac->jstride;
  A[3][1] = (Real)vmac->kstride;
  A[3][2] = (Real)vmac->nstride;
  A[4][0] = *(Real *)&vmac->begin;
  uVar70 = (vmac->end).x;
  uVar71 = (vmac->end).y;
  A._116_8_ = *(undefined8 *)&(vmac->end).z;
  A[4][1]._0_4_ = (undefined4)*(undefined8 *)&(vmac->begin).z;
  A[6][1] = (Real)Imy->p;
  A[6][2] = (Real)Imy->jstride;
  A[7][0] = (Real)Imy->kstride;
  A[7][1] = (Real)Imy->nstride;
  A[7][2] = *(Real *)&Imy->begin;
  uVar68 = *(undefined8 *)&(Imy->begin).z;
  uVar72 = (Imy->end).y;
  A[8]._12_8_ = *(undefined8 *)&(Imy->end).z;
  A[8][0]._0_4_ = (undefined4)uVar68;
  A[8][0]._4_4_ = (undefined4)((ulong)uVar68 >> 0x20);
  A[9][0] = (Real)Ipy->p;
  A[9][1] = (Real)Ipy->jstride;
  A[9][2] = (Real)Ipy->kstride;
  A[10][0] = (Real)Ipy->nstride;
  A[10][1] = *(Real *)&Ipy->begin;
  uVar73 = (Ipy->end).x;
  uVar74 = (Ipy->end).y;
  A[0xb]._4_8_ = *(undefined8 *)&(Ipy->end).z;
  A[10][2]._0_4_ = (undefined4)*(undefined8 *)&(Ipy->begin).z;
  A[0xc][0] = (Real)pbc;
  A[0xc][1] = (Real)flag->p;
  A[0xc][2] = (Real)flag->jstride;
  A[0xd][0] = (Real)flag->kstride;
  A[0xd][1] = (Real)flag->nstride;
  A[0xd][2] = *(Real *)&flag->begin;
  uVar68 = *(undefined8 *)&(flag->begin).z;
  uVar75 = (flag->end).y;
  A[0xe]._12_8_ = *(undefined8 *)&(flag->end).z;
  A[0xe][0]._0_4_ = (undefined4)uVar68;
  A[0xe][0]._4_4_ = (undefined4)((ulong)uVar68 >> 0x20);
  A[0xf][0] = (Real)vfrac->p;
  A[0xf][1] = (Real)vfrac->jstride;
  A[0xf][2] = (Real)vfrac->kstride;
  A[0x10][0] = (Real)vfrac->nstride;
  A[0x10][1] = *(Real *)&vfrac->begin;
  uVar68 = *(undefined8 *)&(vfrac->begin).z;
  uVar76 = (vfrac->end).y;
  A[0x11]._4_8_ = *(undefined8 *)&(vfrac->end).z;
  A[0x10][2]._0_4_ = (undefined4)uVar68;
  A[0x10][2]._4_4_ = (undefined4)((ulong)uVar68 >> 0x20);
  A[0x11][2] = (Real)ccc->p;
  A[0x12][0] = (Real)ccc->jstride;
  A[0x12][1] = (Real)ccc->kstride;
  A[0x12][2] = (Real)ccc->nstride;
  A[0x13][0] = *(Real *)&ccc->begin;
  uVar68 = *(undefined8 *)&(ccc->begin).z;
  uVar77 = (ccc->end).y;
  A._476_8_ = *(undefined8 *)&(ccc->end).z;
  A[0x13][1]._0_4_ = (undefined4)uVar68;
  A[0x13][1]._4_4_ = (undefined4)((ulong)uVar68 >> 0x20);
  A[0x14][1] = (Real)fcx->p;
  A[0x14][2] = (Real)fcx->jstride;
  A[0x15][0] = (Real)fcx->kstride;
  A[0x15][1] = (Real)fcx->nstride;
  A[0x15][2] = *(Real *)&fcx->begin;
  uVar68 = *(undefined8 *)&(fcx->begin).z;
  uVar78 = (fcx->end).y;
  A[0x16]._12_8_ = *(undefined8 *)&(fcx->end).z;
  A[0x16][0]._0_4_ = (undefined4)uVar68;
  A[0x16][0]._4_4_ = (undefined4)((ulong)uVar68 >> 0x20);
  A[0x17][0] = (Real)fcy->p;
  A[0x17][1] = (Real)fcy->jstride;
  A[0x17][2] = (Real)fcy->kstride;
  A[0x18][0] = (Real)fcy->nstride;
  A[0x18][1] = *(Real *)&fcy->begin;
  uVar68 = *(undefined8 *)&(fcy->begin).z;
  uVar79 = (fcy->end).y;
  A[0x19]._4_8_ = *(undefined8 *)&(fcy->end).z;
  A[0x18][2]._0_4_ = (undefined4)uVar68;
  A[0x18][2]._4_4_ = (undefined4)((ulong)uVar68 >> 0x20);
  A[0x19][2] = (Real)fcz->p;
  A[0x1a][0] = (Real)fcz->jstride;
  A[0x1a][1] = (Real)fcz->kstride;
  A[0x1a][2] = (Real)fcz->nstride;
  iVar11 = (yebox->smallend).vect[0];
  iVar12 = (yebox->smallend).vect[1];
  iVar13 = (yebox->smallend).vect[2];
  iVar15 = (yebox->bigend).vect[1];
  iVar16 = (yebox->bigend).vect[2];
  iVar130 = 0;
  if (ncomp < 1) {
    ncomp = 0;
  }
  A[2][0]._0_4_ = uVar69;
  A[4][1]._4_4_ = uVar70;
  A[4][2]._0_4_ = uVar71;
  A[5][1]._0_4_ = iVar172;
  A[5][1]._4_4_ = iVar180;
  A[5][2]._0_4_ = iVar6;
  A[5][2]._4_4_ = iVar165;
  A[6][0]._0_4_ = iVar5;
  A[6][0]._4_4_ = iVar7;
  A[8][1]._0_4_ = uVar72;
  A[10][2]._4_4_ = uVar73;
  A[0xb][0]._0_4_ = uVar74;
  A[0xb][2] = dVar184;
  A[0xe][1]._0_4_ = uVar75;
  A[0x11][0]._0_4_ = uVar76;
  A[0x13][2]._0_4_ = uVar77;
  A[0x16][1]._0_4_ = uVar78;
  A[0x19][0]._0_4_ = uVar79;
  for (; iVar172 = iVar13, iVar130 != ncomp; iVar130 = iVar130 + 1) {
    for (; iVar180 = iVar12, iVar172 <= iVar16; iVar172 = iVar172 + 1) {
      for (; iVar180 <= iVar15; iVar180 = iVar180 + 1) {
        iVar165 = iVar11;
        if (iVar11 <= iVar8) {
          do {
            PredictStateOnYFace::anon_class_688_19_b0541dda::operator()
                      ((anon_class_688_19_b0541dda *)A,iVar165,iVar180,iVar172,iVar130);
            iVar165 = iVar165 + 1;
          } while (iVar8 + 1 != iVar165);
        }
      }
    }
  }
  return;
}

Assistant:

void
EBPLM::PredictStateOnYFace ( Box const& yebox, int ncomp,
                             Array4<Real> const& Imy, Array4<Real> const& Ipy,
                             Array4<Real const> const& q,
                             Array4<Real const> const& vmac,
                             Array4<EBCellFlag const> const& flag,
                             Array4<Real const> const& vfrac,
                             AMREX_D_DECL(Array4<Real const> const& fcx,
                                          Array4<Real const> const& fcy,
                                          Array4<Real const> const& fcz),
                             Array4<Real const> const& ccc,
                             Geometry const& geom,
                             Real dt,
                             Vector<BCRec> const& h_bcrec,
                             BCRec const* pbc, bool is_velocity)
{
    const Real dy = geom.CellSize(1);
    const Real dtdy = dt/dy;

    const Box& domain_box = geom.Domain();
    const int domain_ilo = domain_box.smallEnd(0);
    const int domain_ihi = domain_box.bigEnd(0);
    const int domain_jlo = domain_box.smallEnd(1);
    const int domain_jhi = domain_box.bigEnd(1);

    // At an ext_dir boundary, the boundary value is on the face, not cell center.
    auto extdir_lohi_x = has_extdir_or_ho(h_bcrec.data(), ncomp, static_cast<int>(Direction::x));
    auto extdir_lohi_y = has_extdir_or_ho(h_bcrec.data(), ncomp, static_cast<int>(Direction::y));

    bool has_extdir_or_ho_lo_x = extdir_lohi_x.first;
    bool has_extdir_or_ho_hi_x = extdir_lohi_x.second;
    bool has_extdir_or_ho_lo_y = extdir_lohi_y.first;
    bool has_extdir_or_ho_hi_y = extdir_lohi_y.second;

#if (AMREX_SPACEDIM == 3)
    const int domain_klo = domain_box.smallEnd(2);
    const int domain_khi = domain_box.bigEnd(2);
    auto extdir_lohi_z = has_extdir_or_ho(h_bcrec.data(), ncomp, static_cast<int>(Direction::z));
    bool has_extdir_or_ho_lo_z = extdir_lohi_z.first;
    bool has_extdir_or_ho_hi_z = extdir_lohi_z.second;
#endif

    if ( (has_extdir_or_ho_lo_x && domain_ilo >= yebox.smallEnd(0)-1) ||
         (has_extdir_or_ho_hi_x && domain_ihi <= yebox.bigEnd(0)    ) ||
#if (AMREX_SPACEDIM == 3)
         (has_extdir_or_ho_lo_z && domain_klo >= yebox.smallEnd(2)-1) ||
         (has_extdir_or_ho_hi_z && domain_khi <= yebox.bigEnd(2)    ) ||
#endif
         (has_extdir_or_ho_lo_y && domain_jlo >= yebox.smallEnd(1)-1) ||
         (has_extdir_or_ho_hi_y && domain_jhi <= yebox.bigEnd(1)    )  )
    {
        amrex::ParallelFor(yebox, ncomp, [q,vmac,AMREX_D_DECL(domain_ilo,domain_jlo,domain_klo),
                                                AMREX_D_DECL(domain_ihi,domain_jhi,domain_khi),
                                          Imy,Ipy,dtdy,pbc,flag,vfrac,ccc,AMREX_D_DECL(fcx,fcy,fcz),
                                          is_velocity]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            Real qpls(0.);
            Real qmns(0.);

            // This means apy(i,j,k) > 0 and we have un-covered cells on both sides
            if (flag(i,j,k).isConnected(0,-1,0))
            {
                const auto& bc = pbc[n];
                bool extdir_or_ho_ilo = (bc.lo(0) == BCType::ext_dir) ||
                                        (bc.lo(0) == BCType::hoextrap);
                bool extdir_or_ho_ihi = (bc.hi(0) == BCType::ext_dir) ||
                                        (bc.hi(0) == BCType::hoextrap);
                bool extdir_or_ho_jlo = (bc.lo(1) == BCType::ext_dir) ||
                                        (bc.lo(1) == BCType::hoextrap);
                bool extdir_or_ho_jhi = (bc.hi(1) == BCType::ext_dir) ||
                                        (bc.hi(1) == BCType::hoextrap);
#if (AMREX_SPACEDIM == 3)
                bool extdir_or_ho_klo = (bc.lo(2) == BCType::ext_dir) ||
                                        (bc.lo(2) == BCType::hoextrap);
                bool extdir_or_ho_khi = (bc.hi(2) == BCType::ext_dir) ||
                                        (bc.hi(2) == BCType::hoextrap);
#endif

                // *************************************************
                // Making qpls
                // *************************************************

                // We have enough cells to do 4th order slopes centered on (i,j,k) with all values at cell centers
                if (vfrac(i,j,k) == 1. && vfrac(i,j-1,k) == 1. && vfrac(i,j-2,k) == 1. &&
                                          vfrac(i,j+1,k) == 1. && vfrac(i,j+2,k) == 1.)
                {
                    int order = 4;
                    qpls = q(i,j  ,k,n) + 0.5 * (-1.0 - vmac(i,j,k) * dtdy) *
                        amrex_calc_yslope_extdir(i,j,k,n,order,q,extdir_or_ho_jlo,extdir_or_ho_jhi,domain_jlo,domain_jhi);

                // We have enough cells to do 2nd order slopes with all values at cell centers
                } else if (vfrac(i,j,k) == 1. && vfrac(i,j-1,k) == 1. && vfrac(i,j+1,k) == 1.) {

                    int order = 2;
                    qpls = q(i,j  ,k,n) + 0.5 * (-1.0 - vmac(i,j,k) * dtdy) *
                        amrex_calc_yslope_extdir(i,j,k,n,order,q,extdir_or_ho_jlo,extdir_or_ho_jhi,domain_jlo,domain_jhi);

                // We need to use LS slopes
                } else {

                   Real xf = fcy(i,j,k,0); // local (x,z) of centroid of y-face we are extrapolating to
#if (AMREX_SPACEDIM == 3)
                   Real zf = fcy(i,j,k,1);
#endif
                   AMREX_D_TERM(Real delta_y = 0.5 + ccc(i,j,k,1);,
                                Real delta_x = xf  - ccc(i,j,k,0);,
                                Real delta_z = zf  - ccc(i,j,k,2););

                   Real qcc_max = amrex::max(q(i,j,k,n), q(i,j-1,k,n));
                   Real qcc_min = amrex::min(q(i,j,k,n), q(i,j-1,k,n));

                   // This will be used in the EB slope routine only if the slope can be computed without LS
                   int max_order = 2;

                   const auto& slopes_eb_hi = amrex_lim_slopes_extdir_eb(i,j,k,n,q,ccc,vfrac,
                                              AMREX_D_DECL(fcx,fcy,fcz), flag,
                                              AMREX_D_DECL(extdir_or_ho_ilo, extdir_or_ho_jlo, extdir_or_ho_klo),
                                              AMREX_D_DECL(extdir_or_ho_ihi, extdir_or_ho_jhi, extdir_or_ho_khi),
                                              AMREX_D_DECL(domain_ilo, domain_jlo, domain_klo),
                                              AMREX_D_DECL(domain_ihi, domain_jhi, domain_khi),
                                              max_order);

#if (AMREX_SPACEDIM == 3)
                   qpls = q(i,j,k,n) - delta_y * slopes_eb_hi[1]
                                     + delta_x * slopes_eb_hi[0]
                                     + delta_z * slopes_eb_hi[2];
#else
                   qpls = q(i,j,k,n) - delta_y * slopes_eb_hi[1]
                                     + delta_x * slopes_eb_hi[0];
#endif
                   qpls = amrex::max(amrex::min(qpls, qcc_max), qcc_min);
                   qpls -= 0.5 * dtdy * vmac(i,j,k) * slopes_eb_hi[1];

                }  // end of making qpls

                // Only over-write normal velocity with Dirichlet bc at lo face
                if (j == domain_jlo && (bc.lo(1) == BCType::ext_dir))
                    if (is_velocity && n == 1) qpls = q(i,j-1,k,n);

                // Over-write all with Dirichlet bc at hi face
                if (j == domain_jhi+1 && (bc.hi(1) == BCType::ext_dir))
                    qpls = q(i,j,k,n);

                // *************************************************
                // Making qmns
                // *************************************************

                // We have enough cells to do 4th order slopes centered on (i,j-1,k) with all values at cell centers
                if (vfrac(i,j-1,k) == 1. && vfrac(i,j-2,k) == 1. && vfrac(i,j-3,k) == 1. &&
                                            vfrac(i,j  ,k) == 1. && vfrac(i,j+1,k) == 1.)
                {
                    int order = 4;
                    qmns = q(i,j-1,k,n) + 0.5 * ( 1.0 - vmac(i,j,k) * dtdy) *
                        amrex_calc_yslope_extdir(i,j-1,k,n,order,q,extdir_or_ho_jlo,extdir_or_ho_jhi,domain_jlo,domain_jhi);

                // We have enough cells to do 2nd order slopes with all values at cell centers
                } else if (vfrac(i,j-1,k) == 1. && vfrac(i,j-2,k) == 1. && vfrac(i,j  ,k) == 1.)
                {
                    int order = 2;
                    qmns = q(i,j-1,k,n) + 0.5 * ( 1.0 - vmac(i,j,k) * dtdy) *
                        amrex_calc_yslope_extdir(i,j-1,k,n,order,q,extdir_or_ho_jlo,extdir_or_ho_jhi,domain_jlo,domain_jhi);

                // We need to use LS slopes
                } else {

                   Real xf = fcy(i,j,k,0); // local (x,z) of centroid of y-face we are extrapolating to
#if (AMREX_SPACEDIM == 3)
                   Real zf = fcy(i,j,k,1);
#endif
                   AMREX_D_TERM(Real delta_y = 0.5 - ccc(i,j-1,k,1);,
                                Real delta_x = xf  - ccc(i,j-1,k,0);,
                                Real delta_z = zf  - ccc(i,j-1,k,2););

                   Real qcc_max = amrex::max(q(i,j,k,n), q(i,j-1,k,n));
                   Real qcc_min = amrex::min(q(i,j,k,n), q(i,j-1,k,n));

                   // This will be used in the EB slope routine only if the slope can be computed without LS
                   int max_order = 2;

                   const auto& slopes_eb_lo = amrex_lim_slopes_extdir_eb(i,j-1,k,n,q,ccc,vfrac,
                                              AMREX_D_DECL(fcx,fcy,fcz), flag,
                                              AMREX_D_DECL(extdir_or_ho_ilo, extdir_or_ho_jlo, extdir_or_ho_klo),
                                              AMREX_D_DECL(extdir_or_ho_ihi, extdir_or_ho_jhi, extdir_or_ho_khi),
                                              AMREX_D_DECL(domain_ilo, domain_jlo, domain_klo),
                                              AMREX_D_DECL(domain_ihi, domain_jhi, domain_khi),
                                              max_order);


#if (AMREX_SPACEDIM == 3)
                   qmns = q(i,j-1,k,n) + delta_x * slopes_eb_lo[0]
                                       + delta_y * slopes_eb_lo[1]
                                       + delta_z * slopes_eb_lo[2];
#else
                   qmns = q(i,j-1,k,n) + delta_x * slopes_eb_lo[0]
                                       + delta_y * slopes_eb_lo[1];
#endif
                   qmns = amrex::max(amrex::min(qmns, qcc_max), qcc_min);
                   qmns -= 0.5 * dtdy * vmac(i,j,k) * slopes_eb_lo[1];

                }  // end of making qmns

                // Over-write all with Dirichlet bc at lo face
                if (j == domain_jlo && (bc.lo(1) == BCType::ext_dir))
                    qmns = q(i,j-1,k,n);

                // Only over-write normal velocity with Dirichlet bc at hi face
                if (j == domain_jhi+1 && (bc.hi(1) == BCType::ext_dir))
                    if (is_velocity && n == 1) qmns = q(i,j,k,n);
            }

            Ipy(i,j-1,k,n) = qmns;
            Imy(i,j  ,k,n) = qpls;
        });
    }
    else // The cases below are not near any domain boundary
    {
        amrex::ParallelFor(yebox, ncomp, [q,vmac,AMREX_D_DECL(domain_ilo,domain_jlo,domain_klo),
                                                AMREX_D_DECL(domain_ihi,domain_jhi,domain_khi),
                                          Imy,Ipy,dt,dtdy,pbc,flag,vfrac,ccc,AMREX_D_DECL(fcx,fcy,fcz),
                                          is_velocity]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            Real qpls(0.);
            Real qmns(0.);

            // This means apy(i,j,k) > 0 and we have un-covered cells on both sides
            if (flag(i,j,k).isConnected(0,-1,0))
            {
                // *************************************************
                // Making qpls
                // *************************************************

                // We have enough cells to do 4th order slopes centered on (i,j,k) with all values at cell centers
                if (vfrac(i,j,k) == 1. && vfrac(i,j-1,k) == 1. && vfrac(i,j-2,k) == 1. &&
                                          vfrac(i,j+1,k) == 1. && vfrac(i,j+2,k) == 1.)
                {
                    int order = 4;
                    qpls = q(i,j,k,n) + 0.5 * (-1.0 - vmac(i,j,k) * dtdy) *
                        amrex_calc_yslope(i,j,k,n,order,q);

                // We have enough cells to do 2nd order slopes with all values at cell centers
                } else if (vfrac(i,j,k) == 1. && vfrac(i,j-1,k) == 1. && vfrac(i,j+1,k) == 1.) {

                    int order = 2;
                    qpls = q(i,j,k,n) + 0.5 * (-1.0 - vmac(i,j,k) * dtdy) *
                        amrex_calc_yslope(i,j,k,n,order,q);

                // We need to use LS slopes
                } else {

                   Real xf = fcy(i,j,k,0); // local (x,z) of centroid of y-face we are extrapolating to
#if (AMREX_SPACEDIM == 3)
                   Real zf = fcy(i,j,k,1);
#endif
                   AMREX_D_TERM(Real delta_y = 0.5 + ccc(i,j,k,1);,
                                Real delta_x = xf  - ccc(i,j,k,0);,
                                Real delta_z = zf  - ccc(i,j,k,2););

                   Real qcc_max = amrex::max(q(i,j,k,n), q(i,j-1,k,n));
                   Real qcc_min = amrex::min(q(i,j,k,n), q(i,j-1,k,n));

                   // This will be used in the EB slope routine only if the slope can be computed without LS
                   int max_order = 2;

                   const auto& slopes_eb_hi = amrex_lim_slopes_eb(i,j,k,n,q,ccc,vfrac,
                                                                  AMREX_D_DECL(fcx,fcy,fcz),flag,max_order);

#if (AMREX_SPACEDIM == 3)
                   qpls = q(i,j,k,n) - delta_y * slopes_eb_hi[1]
                                     + delta_x * slopes_eb_hi[0]
                                     + delta_z * slopes_eb_hi[2];
#else
                   qpls = q(i,j,k,n) - delta_y * slopes_eb_hi[1]
                                     + delta_x * slopes_eb_hi[0];
#endif
                   qpls = amrex::max(amrex::min(qpls, qcc_max), qcc_min);
                   qpls -= 0.5 * dtdy * vmac(i,j,k) * slopes_eb_hi[1];

                }  // end of making qpls

                // *************************************************
                // Making qmns
                // *************************************************

                // We have enough cells to do 4th order slopes centered on (i,j-1,k) with all values at cell centers
                if (vfrac(i,j-1,k) == 1. && vfrac(i,j-2,k) == 1. && vfrac(i,j-3,k) == 1. &&
                                            vfrac(i,j  ,k) == 1. && vfrac(i,j+1,k) == 1.)
                {
                    int order = 4;
                    qmns = q(i,j-1,k,n) + 0.5 * ( 1.0 - vmac(i,j,k) * dtdy) *
                        amrex_calc_yslope(i,j-1,k,n,order,q);

                // We have enough cells to do 2nd order slopes with all values at cell centers
                } else if (vfrac(i,j-1,k) == 1. && vfrac(i,j-2,k) == 1. && vfrac(i,j  ,k) == 1.)
                {
                    int order = 2;
                    qmns = q(i,j-1,k,n) + 0.5 * ( 1.0 - vmac(i,j,k) * dtdy) *
                        amrex_calc_yslope(i,j-1,k,n,order,q);

                // We need to use LS slopes
                } else {

                   Real xf = fcy(i,j,k,0); // local (x,z) of centroid of y-face we are extrapolating to
#if (AMREX_SPACEDIM == 3)
                   Real zf = fcy(i,j,k,1);
#endif
                   AMREX_D_TERM(Real delta_y = 0.5 - ccc(i,j-1,k,1);,
                                Real delta_x = xf  - ccc(i,j-1,k,0);,
                                Real delta_z = zf  - ccc(i,j-1,k,2););

                   Real qcc_max = amrex::max(q(i,j,k,n), q(i,j-1,k,n));
                   Real qcc_min = amrex::min(q(i,j,k,n), q(i,j-1,k,n));

                   // This will be used in the EB slope routine only if the slope can be computed without LS
                   int max_order = 2;

                   const auto& slopes_eb_lo = amrex_lim_slopes_eb(i,j-1,k,n,q,ccc,vfrac,
                                                                  AMREX_D_DECL(fcx,fcy,fcz),flag,max_order);

#if (AMREX_SPACEDIM == 3)
                   qmns = q(i,j-1,k,n) + delta_x * slopes_eb_lo[0]
                                       + delta_y * slopes_eb_lo[1]
                                       + delta_z * slopes_eb_lo[2];
#else
                   qmns = q(i,j-1,k,n) + delta_x * slopes_eb_lo[0]
                                       + delta_y * slopes_eb_lo[1];
#endif
                   qmns = amrex::max(amrex::min(qmns, qcc_max), qcc_min);
                   qmns -= 0.5 * dtdy * vmac(i,j,k) * slopes_eb_lo[1];

                }  // end of making qmns
            }

            Ipy(i,j-1,k,n) = qmns;
            Imy(i,j  ,k,n) = qpls;
        });
    }
}